

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfo * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  BufferView<embree::Vec3fa> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar12;
  undefined4 uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  long lVar19;
  unsigned_long uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  float fVar76;
  float fVar82;
  vfloat4 a0;
  undefined1 auVar31 [16];
  float fVar77;
  uint uVar78;
  uint uVar79;
  float fVar83;
  uint uVar84;
  uint uVar85;
  float fVar87;
  uint uVar88;
  uint uVar89;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  uint uVar80;
  uint uVar81;
  uint uVar86;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar75;
  float fVar90;
  float fVar114;
  Vec3fa n0;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar115;
  float fVar116;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar131;
  uint uVar132;
  float fVar139;
  uint uVar140;
  float fVar141;
  uint uVar142;
  float fVar143;
  uint uVar144;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar138;
  float fVar145;
  float fVar146;
  float fVar154;
  float fVar155;
  Vec3ff v3;
  float fVar156;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar167;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar168;
  float fVar169;
  float fVar176;
  float fVar178;
  Vec3fa n1;
  float fVar177;
  float fVar179;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar180;
  float fVar187;
  float fVar188;
  vfloat4 a_1;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar189;
  float fVar190;
  float fVar198;
  float fVar199;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar200;
  float fVar204;
  float fVar205;
  float fVar206;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar207;
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar221;
  float fVar222;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar233 [16];
  float fVar234;
  float fVar239;
  float fVar240;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  undefined8 uStack_250;
  undefined1 local_248 [8];
  undefined8 uStack_240;
  uint local_228;
  uint uStack_224;
  uint uStack_220;
  uint uStack_21c;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  size_t local_c8;
  size_t local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
  *pCVar18;
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar20 = r->_begin;
  local_c8 = 0;
  local_88 = _DAT_01f45a40;
  local_98 = _DAT_01f45a30;
  local_a8 = _DAT_01f45a40;
  local_b8 = _DAT_01f45a30;
  local_c0 = k;
  while( true ) {
    if (r->_end <= uVar20) {
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
        field_0 = local_b8._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
               lower.field_0 + 8) = local_b8._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
        field_0 = local_a8._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
               upper.field_0 + 8) = local_a8._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
        field_0 = local_98._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
               lower.field_0 + 8) = local_98._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
        field_0 = local_88._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
               upper.field_0 + 8) = local_88._8_8_;
      __return_storage_ptr__->end = local_c8;
      return __return_storage_ptr__;
    }
    pBVar5 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
             vertices.items;
    uVar17 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.super_Geometry.field_0x58 +
                      *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                super_CurveGeometry.field_0x68 * uVar20);
    uVar16 = (ulong)uVar17;
    uVar21 = (ulong)(uVar17 + 3);
    if (uVar21 < (pBVar5->super_RawBufferView).num) break;
LAB_002449f1:
    uVar20 = uVar20 + 1;
  }
  uVar22 = (ulong)(uVar17 + 1);
  uVar23 = (ulong)(uVar17 + 2);
  pBVar6 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           normals.items;
  fVar146 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
            maxRadiusScale;
  lVar19 = 0;
  pCVar18 = this;
LAB_002439df:
  if (lVar19 == (ulong)((this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                        super_CurveGeometry.super_Geometry.numTimeSteps - 1) + 1) {
    pcVar7 = (pBVar5->super_RawBufferView).ptr_ofs;
    sVar8 = (pBVar5->super_RawBufferView).stride;
    pfVar1 = (float *)(pcVar7 + sVar8 * uVar16);
    fVar26 = *pfVar1;
    fVar77 = pfVar1[1];
    fVar83 = pfVar1[2];
    pfVar2 = (float *)(pcVar7 + sVar8 * uVar22);
    fVar24 = *pfVar2;
    fVar129 = pfVar2[1];
    fVar115 = pfVar2[2];
    pfVar3 = (float *)(pcVar7 + sVar8 * uVar23);
    fVar125 = *pfVar3;
    fVar127 = pfVar3[1];
    fVar143 = pfVar3[2];
    pfVar4 = (float *)(pcVar7 + sVar8 * uVar21);
    fVar131 = *pfVar4;
    fVar139 = pfVar4[1];
    fVar141 = pfVar4[2];
    fVar146 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
              maxRadiusScale;
    fVar230 = pfVar1[3] * fVar146;
    fVar221 = pfVar2[3] * fVar146;
    fVar227 = pfVar3[3] * fVar146;
    fVar146 = pfVar4[3] * fVar146;
    pBVar6 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
             normals.items;
    pcVar7 = (pBVar6->super_RawBufferView).ptr_ofs;
    sVar8 = (pBVar6->super_RawBufferView).stride;
    pfVar1 = (float *)(pcVar7 + uVar16 * sVar8);
    fVar156 = *pfVar1;
    fVar145 = pfVar1[1];
    fVar154 = pfVar1[2];
    pfVar1 = (float *)(pcVar7 + uVar22 * sVar8);
    fVar155 = *pfVar1;
    fVar167 = pfVar1[1];
    fVar90 = pfVar1[2];
    pfVar1 = (float *)(pcVar7 + uVar23 * sVar8);
    fVar114 = *pfVar1;
    fVar213 = pfVar1[1];
    fVar168 = pfVar1[2];
    pfVar1 = (float *)(pcVar7 + sVar8 * uVar21);
    fVar176 = *pfVar1;
    fVar187 = pfVar1[1];
    fVar188 = pfVar1[2];
    fVar87 = fVar125 * 0.0 + fVar131 * -0.0 + fVar24 + fVar26 * -0.0;
    fVar222 = fVar127 * 0.0 + fVar139 * -0.0 + fVar129 + fVar77 * -0.0;
    fVar228 = fVar143 * 0.0 + fVar141 * -0.0 + fVar115 + fVar83 * -0.0;
    fVar198 = fVar227 * 0.0 + fVar146 * -0.0 + fVar221 + fVar230 * -0.0;
    fVar190 = (fVar125 * 0.5 + fVar131 * 0.0 + fVar24 * 0.0) - fVar26 * 0.5;
    fVar234 = (fVar127 * 0.5 + fVar139 * 0.0 + fVar129 * 0.0) - fVar77 * 0.5;
    fVar239 = (fVar143 * 0.5 + fVar141 * 0.0 + fVar115 * 0.0) - fVar83 * 0.5;
    fVar240 = (fVar227 * 0.5 + fVar146 * 0.0 + fVar221 * 0.0) - fVar230 * 0.5;
    fVar178 = (fVar114 * 0.5 + fVar176 * 0.0 + fVar155 * 0.0) - fVar156 * 0.5;
    fVar179 = (fVar213 * 0.5 + fVar187 * 0.0 + fVar167 * 0.0) - fVar145 * 0.5;
    fVar189 = (fVar168 * 0.5 + fVar188 * 0.0 + fVar90 * 0.0) - fVar154 * 0.5;
    fVar199 = fVar114 * 0.0 + fVar176 * -0.0 + fVar155 + fVar156 * -0.0;
    fVar207 = fVar213 * 0.0 + fVar187 * -0.0 + fVar167 + fVar145 * -0.0;
    fVar211 = fVar168 * 0.0 + fVar188 * -0.0 + fVar90 + fVar154 * -0.0;
    fVar25 = fVar131 * -0.0 + fVar125 + fVar24 * 0.0 + fVar26 * -0.0;
    fVar76 = fVar139 * -0.0 + fVar127 + fVar129 * 0.0 + fVar77 * -0.0;
    fVar82 = fVar141 * -0.0 + fVar143 + fVar115 * 0.0 + fVar83 * -0.0;
    fVar212 = fVar146 * -0.0 + fVar227 + fVar221 * 0.0 + fVar230 * -0.0;
    fVar229 = fVar26 * 0.0 + ((fVar131 * 0.5 + fVar125 * 0.0) - fVar24 * 0.5);
    fVar169 = fVar77 * 0.0 + ((fVar139 * 0.5 + fVar127 * 0.0) - fVar129 * 0.5);
    fVar177 = fVar83 * 0.0 + ((fVar141 * 0.5 + fVar143 * 0.0) - fVar115 * 0.5);
    fVar230 = fVar230 * 0.0 + ((fVar146 * 0.5 + fVar227 * 0.0) - fVar221 * 0.5);
    fVar83 = fVar176 * -0.0 + fVar114 + fVar155 * 0.0 + fVar156 * -0.0;
    fVar24 = fVar187 * -0.0 + fVar213 + fVar167 * 0.0 + fVar145 * -0.0;
    fVar129 = fVar188 * -0.0 + fVar168 + fVar90 * 0.0 + fVar154 * -0.0;
    fVar146 = fVar156 * 0.0 + ((fVar176 * 0.5 + fVar114 * 0.0) - fVar155 * 0.5);
    fVar26 = fVar145 * 0.0 + ((fVar187 * 0.5 + fVar213 * 0.0) - fVar167 * 0.5);
    fVar77 = fVar154 * 0.0 + ((fVar188 * 0.5 + fVar168 * 0.0) - fVar90 * 0.5);
    fVar90 = fVar234 * fVar199 - fVar207 * fVar190;
    fVar114 = fVar239 * fVar207 - fVar211 * fVar234;
    fVar213 = fVar190 * fVar211 - fVar199 * fVar239;
    fVar145 = fVar234 * fVar178 - fVar179 * fVar190;
    fVar154 = fVar239 * fVar179 - fVar189 * fVar234;
    fVar155 = fVar190 * fVar189 - fVar178 * fVar239;
    fVar125 = fVar169 * fVar83 - fVar24 * fVar229;
    fVar131 = fVar177 * fVar24 - fVar129 * fVar169;
    fVar141 = fVar229 * fVar129 - fVar83 * fVar177;
    fVar83 = fVar169 * fVar146 - fVar26 * fVar229;
    fVar129 = fVar177 * fVar26 - fVar77 * fVar169;
    fVar115 = fVar229 * fVar77 - fVar146 * fVar177;
    fVar26 = fVar213 * fVar213 + fVar114 * fVar114 + fVar90 * fVar90;
    auVar191 = ZEXT416((uint)fVar26);
    auVar95 = rsqrtss(ZEXT416((uint)fVar26),auVar191);
    fVar146 = auVar95._0_4_;
    fVar77 = fVar146 * 1.5 - fVar146 * fVar146 * fVar26 * 0.5 * fVar146;
    fVar168 = fVar90 * fVar145 + fVar213 * fVar155 + fVar114 * fVar154;
    auVar95 = rcpss(auVar191,auVar191);
    fVar146 = (2.0 - fVar26 * auVar95._0_4_) * auVar95._0_4_;
    fVar167 = fVar141 * fVar141 + fVar131 * fVar131 + fVar125 * fVar125;
    auVar95 = ZEXT416((uint)fVar167);
    auVar191 = rsqrtss(ZEXT416((uint)fVar167),auVar95);
    fVar24 = auVar191._0_4_;
    fVar127 = fVar24 * 1.5 - fVar24 * fVar24 * fVar167 * 0.5 * fVar24;
    fVar176 = fVar125 * fVar83 + fVar141 * fVar115 + fVar131 * fVar129;
    auVar95 = rcpss(auVar95,auVar95);
    fVar24 = (2.0 - fVar167 * auVar95._0_4_) * auVar95._0_4_;
    fVar143 = fVar198 * fVar114 * fVar77;
    fVar139 = fVar198 * fVar213 * fVar77;
    fVar156 = fVar198 * fVar90 * fVar77;
    fVar187 = fVar87 - fVar143;
    fVar188 = fVar222 - fVar139;
    fVar221 = fVar228 - fVar156;
    fVar154 = fVar198 * fVar146 * (fVar26 * fVar154 - fVar168 * fVar114) * fVar77 +
              fVar240 * fVar114 * fVar77;
    fVar155 = fVar198 * fVar146 * (fVar26 * fVar155 - fVar168 * fVar213) * fVar77 +
              fVar240 * fVar213 * fVar77;
    fVar90 = fVar198 * fVar146 * (fVar26 * fVar145 - fVar168 * fVar90) * fVar77 +
             fVar240 * fVar90 * fVar77;
    fVar146 = fVar212 * fVar131 * fVar127;
    fVar26 = fVar212 * fVar141 * fVar127;
    fVar77 = fVar212 * fVar125 * fVar127;
    fVar114 = fVar25 - fVar146;
    fVar213 = fVar76 - fVar26;
    fVar168 = fVar82 - fVar77;
    fVar131 = fVar212 * fVar24 * (fVar167 * fVar129 - fVar176 * fVar131) * fVar127 +
              fVar230 * fVar131 * fVar127;
    fVar115 = fVar212 * fVar24 * (fVar167 * fVar115 - fVar176 * fVar141) * fVar127 +
              fVar230 * fVar141 * fVar127;
    fVar125 = fVar212 * fVar24 * (fVar167 * fVar83 - fVar176 * fVar125) * fVar127 +
              fVar230 * fVar125 * fVar127;
    fVar127 = (fVar190 - fVar154) * 0.33333334 + fVar187;
    fVar141 = (fVar234 - fVar155) * 0.33333334 + fVar188;
    fVar145 = (fVar239 - fVar90) * 0.33333334 + fVar221;
    fVar83 = fVar114 - (fVar229 - fVar131) * 0.33333334;
    fVar24 = fVar213 - (fVar169 - fVar115) * 0.33333334;
    fVar129 = fVar168 - (fVar177 - fVar125) * 0.33333334;
    uVar16 = 0;
    _local_248 = _DAT_01f45a40;
    local_2a8 = _DAT_01f45a40;
    local_298._8_8_ = 0x7f8000007f800000;
    local_298._0_8_ = 0x7f8000007f800000;
    local_288._8_8_ = 0x7f8000007f800000;
    local_288._0_8_ = 0x7f8000007f800000;
    uStack_250 = 0x7f8000007f800000;
    local_258 = (undefined1  [8])0x7f8000007f800000;
    auVar95 = _DAT_01f45a40;
    while( true ) {
      uVar80 = local_2a8._0_4_;
      uVar81 = local_2a8._8_4_;
      uVar86 = local_2a8._12_4_;
      uVar17 = local_258._0_4_;
      uVar29 = local_258._8_4_;
      uVar30 = local_258._12_4_;
      if (7 < uVar16) break;
      uVar144 = (uint)uVar16;
      uVar27 = -(uint)(-0x7ffffff9 < (int)(uVar144 ^ 0x80000000));
      uVar28 = -(uint)(-0x7ffffff9 < (int)(uVar144 ^ 0x80000000));
      uVar78 = -(uint)(-0x7ffffff9 < (int)(uVar144 ^ 0x80000000));
      uVar79 = -(uint)(-0x7ffffff9 < (int)(uVar144 ^ 0x80000000));
      lVar19 = uVar16 * 4;
      fVar167 = *(float *)(bezier_basis0 + lVar19 + 0x1dc);
      fVar176 = *(float *)(bezier_basis0 + lVar19 + 0x1e0);
      fVar240 = *(float *)(bezier_basis0 + lVar19 + 0x1e4);
      fVar230 = *(float *)(bezier_basis0 + lVar19 + 0x1e8);
      lVar19 = uVar16 * 4;
      fVar227 = *(float *)(bezier_basis0 + lVar19 + 0x660);
      fVar178 = *(float *)(bezier_basis0 + lVar19 + 0x664);
      fVar179 = *(float *)(bezier_basis0 + lVar19 + 0x668);
      fVar189 = *(float *)(bezier_basis0 + lVar19 + 0x66c);
      lVar19 = uVar16 * 4;
      fVar198 = *(float *)(bezier_basis0 + lVar19 + 0xae4);
      fVar199 = *(float *)(bezier_basis0 + lVar19 + 0xae8);
      fVar207 = *(float *)(bezier_basis0 + lVar19 + 0xaec);
      fVar211 = *(float *)(bezier_basis0 + lVar19 + 0xaf0);
      lVar19 = uVar16 * 4;
      fVar212 = *(float *)(bezier_basis0 + lVar19 + 0xf68);
      fVar231 = *(float *)(bezier_basis0 + lVar19 + 0xf6c);
      fVar232 = *(float *)(bezier_basis0 + lVar19 + 0xf70);
      fVar9 = *(float *)(bezier_basis0 + lVar19 + 0xf74);
      auVar195._0_4_ = fVar187 * fVar167 + fVar127 * fVar227 + fVar83 * fVar198 + fVar114 * fVar212;
      auVar195._4_4_ = fVar187 * fVar176 + fVar127 * fVar178 + fVar83 * fVar199 + fVar114 * fVar231;
      auVar195._8_4_ = fVar187 * fVar240 + fVar127 * fVar179 + fVar83 * fVar207 + fVar114 * fVar232;
      auVar195._12_4_ = fVar187 * fVar230 + fVar127 * fVar189 + fVar83 * fVar211 + fVar114 * fVar9;
      auVar215._0_4_ = fVar188 * fVar167 + fVar141 * fVar227 + fVar24 * fVar198 + fVar213 * fVar212;
      auVar215._4_4_ = fVar188 * fVar176 + fVar141 * fVar178 + fVar24 * fVar199 + fVar213 * fVar231;
      auVar215._8_4_ = fVar188 * fVar240 + fVar141 * fVar179 + fVar24 * fVar207 + fVar213 * fVar232;
      auVar215._12_4_ = fVar188 * fVar230 + fVar141 * fVar189 + fVar24 * fVar211 + fVar213 * fVar9;
      local_f8._0_4_ = fVar167 * fVar221 + fVar227 * fVar145 + fVar198 * fVar129 + fVar212 * fVar168
      ;
      local_f8._4_4_ = fVar176 * fVar221 + fVar178 * fVar145 + fVar199 * fVar129 + fVar231 * fVar168
      ;
      fStack_f0 = fVar240 * fVar221 + fVar179 * fVar145 + fVar207 * fVar129 + fVar232 * fVar168;
      fStack_ec = fVar230 * fVar221 + fVar189 * fVar145 + fVar211 * fVar129 + fVar9 * fVar168;
      lVar19 = uVar16 * 4;
      fVar167 = *(float *)(bezier_basis0 + lVar19 + 0x13ec);
      fVar176 = *(float *)(bezier_basis0 + lVar19 + 0x13f0);
      fVar240 = *(float *)(bezier_basis0 + lVar19 + 0x13f4);
      fVar230 = *(float *)(bezier_basis0 + lVar19 + 0x13f8);
      lVar19 = uVar16 * 4;
      fVar227 = *(float *)(bezier_basis0 + lVar19 + 0x1870);
      fVar178 = *(float *)(bezier_basis0 + lVar19 + 0x1874);
      fVar179 = *(float *)(bezier_basis0 + lVar19 + 0x1878);
      fVar189 = *(float *)(bezier_basis0 + lVar19 + 0x187c);
      lVar19 = uVar16 * 4;
      fVar198 = *(float *)(bezier_basis0 + lVar19 + 0x1cf4);
      fVar199 = *(float *)(bezier_basis0 + lVar19 + 0x1cf8);
      fVar207 = *(float *)(bezier_basis0 + lVar19 + 0x1cfc);
      fVar211 = *(float *)(bezier_basis0 + lVar19 + 0x1d00);
      lVar19 = uVar16 * 4;
      fVar212 = *(float *)(bezier_basis0 + lVar19 + 0x2178);
      fVar231 = *(float *)(bezier_basis0 + lVar19 + 0x217c);
      fVar232 = *(float *)(bezier_basis0 + lVar19 + 0x2180);
      fVar9 = *(float *)(bezier_basis0 + lVar19 + 0x2184);
      fVar180 = fVar187 * fVar167 + fVar127 * fVar227 + fVar83 * fVar198 + fVar114 * fVar212;
      fVar116 = fVar187 * fVar176 + fVar127 * fVar178 + fVar83 * fVar199 + fVar114 * fVar231;
      fVar126 = fVar187 * fVar240 + fVar127 * fVar179 + fVar83 * fVar207 + fVar114 * fVar232;
      fVar128 = fVar187 * fVar230 + fVar127 * fVar189 + fVar83 * fVar211 + fVar114 * fVar9;
      fVar130 = fVar188 * fVar167 + fVar141 * fVar227 + fVar24 * fVar198 + fVar213 * fVar212;
      fVar200 = fVar188 * fVar176 + fVar141 * fVar178 + fVar24 * fVar199 + fVar213 * fVar231;
      fVar204 = fVar188 * fVar240 + fVar141 * fVar179 + fVar24 * fVar207 + fVar213 * fVar232;
      fVar205 = fVar188 * fVar230 + fVar141 * fVar189 + fVar24 * fVar211 + fVar213 * fVar9;
      fVar167 = fVar167 * fVar221 + fVar227 * fVar145 + fVar198 * fVar129 + fVar212 * fVar168;
      fVar176 = fVar176 * fVar221 + fVar178 * fVar145 + fVar199 * fVar129 + fVar231 * fVar168;
      fVar240 = fVar240 * fVar221 + fVar179 * fVar145 + fVar207 * fVar129 + fVar232 * fVar168;
      fVar230 = fVar230 * fVar221 + fVar189 * fVar145 + fVar211 * fVar129 + fVar9 * fVar168;
      uVar84 = -(uint)(uVar144 == 0);
      uVar85 = -(uint)(uVar144 == 1);
      uVar88 = -(uint)(uVar144 == 2);
      uVar89 = -(uint)(uVar144 == 3);
      uVar132 = -(uint)(uVar144 == 7);
      uVar140 = -(uint)(uVar144 == 6);
      uVar142 = -(uint)(uVar144 == 5);
      uVar144 = -(uint)(uVar144 == 4);
      auVar191._0_4_ = (float)(~uVar132 & (uint)fVar180) * 0.055555556 + auVar195._0_4_;
      auVar191._4_4_ = (float)(~uVar140 & (uint)fVar116) * 0.055555556 + auVar195._4_4_;
      auVar191._8_4_ = (float)(~uVar142 & (uint)fVar126) * 0.055555556 + auVar195._8_4_;
      auVar191._12_4_ = (float)(~uVar144 & (uint)fVar128) * 0.055555556 + auVar195._12_4_;
      auVar214 = minps(local_298,auVar195);
      auVar223 = maxps(_local_248,auVar195);
      auVar184._0_8_ =
           CONCAT44(auVar195._4_4_ - (float)(~uVar85 & (uint)fVar116) * 0.055555556,
                    auVar195._0_4_ - (float)(~uVar84 & (uint)fVar180) * 0.055555556);
      auVar184._8_4_ = auVar195._8_4_ - (float)(~uVar88 & (uint)fVar126) * 0.055555556;
      auVar184._12_4_ = auVar195._12_4_ - (float)(~uVar89 & (uint)fVar128) * 0.055555556;
      auVar219._0_4_ = (float)(~uVar132 & (uint)fVar130) * 0.055555556 + auVar215._0_4_;
      auVar219._4_4_ = (float)(~uVar140 & (uint)fVar200) * 0.055555556 + auVar215._4_4_;
      auVar219._8_4_ = (float)(~uVar142 & (uint)fVar204) * 0.055555556 + auVar215._8_4_;
      auVar219._12_4_ = (float)(~uVar144 & (uint)fVar205) * 0.055555556 + auVar215._12_4_;
      auVar133 = minps(local_288,auVar215);
      auVar235 = maxps(local_2a8,auVar215);
      auVar218._0_8_ =
           CONCAT44(auVar215._4_4_ - (float)(~uVar85 & (uint)fVar200) * 0.055555556,
                    auVar215._0_4_ - (float)(~uVar84 & (uint)fVar130) * 0.055555556);
      auVar218._8_4_ = auVar215._8_4_ - (float)(~uVar88 & (uint)fVar204) * 0.055555556;
      auVar218._12_4_ = auVar215._12_4_ - (float)(~uVar89 & (uint)fVar205) * 0.055555556;
      auVar203._0_4_ = (float)(~uVar132 & (uint)fVar167) * 0.055555556 + (float)local_f8._0_4_;
      auVar203._4_4_ = (float)(~uVar140 & (uint)fVar176) * 0.055555556 + (float)local_f8._4_4_;
      auVar203._8_4_ = (float)(~uVar142 & (uint)fVar240) * 0.055555556 + fStack_f0;
      auVar203._12_4_ = (float)(~uVar144 & (uint)fVar230) * 0.055555556 + fStack_ec;
      auVar195 = minps(_local_258,_local_f8);
      auVar225 = maxps(auVar95,_local_f8);
      auVar217._0_8_ =
           CONCAT44((float)local_f8._4_4_ - (float)(~uVar85 & (uint)fVar176) * 0.055555556,
                    (float)local_f8._0_4_ - (float)(~uVar84 & (uint)fVar167) * 0.055555556);
      auVar217._8_4_ = fStack_f0 - (float)(~uVar88 & (uint)fVar240) * 0.055555556;
      auVar217._12_4_ = fStack_ec - (float)(~uVar89 & (uint)fVar230) * 0.055555556;
      auVar233._8_4_ = auVar184._8_4_;
      auVar233._0_8_ = auVar184._0_8_;
      auVar233._12_4_ = auVar184._12_4_;
      auVar215 = minps(auVar233,auVar191);
      auVar233 = minps(auVar214,auVar215);
      auVar171._8_4_ = auVar218._8_4_;
      auVar171._0_8_ = auVar218._0_8_;
      auVar171._12_4_ = auVar218._12_4_;
      auVar214 = minps(auVar171,auVar219);
      auVar214 = minps(auVar133,auVar214);
      auVar172._8_4_ = auVar217._8_4_;
      auVar172._0_8_ = auVar217._0_8_;
      auVar172._12_4_ = auVar217._12_4_;
      auVar133 = minps(auVar172,auVar203);
      auVar215 = minps(auVar195,auVar133);
      local_298._4_4_ = local_298._4_4_ & uVar28 | ~uVar28 & auVar233._4_4_;
      local_298._0_4_ = local_298._0_4_ & uVar27 | ~uVar27 & auVar233._0_4_;
      local_298._8_4_ = local_298._8_4_ & uVar78 | ~uVar78 & auVar233._8_4_;
      local_298._12_4_ = local_298._12_4_ & uVar79 | ~uVar79 & auVar233._12_4_;
      auVar133._0_4_ = ~uVar27 & auVar214._0_4_;
      auVar133._4_4_ = ~uVar28 & auVar214._4_4_;
      auVar133._8_4_ = ~uVar78 & auVar214._8_4_;
      auVar133._12_4_ = ~uVar79 & auVar214._12_4_;
      auVar238._0_4_ = local_288._0_4_ & uVar27;
      auVar238._4_4_ = local_288._4_4_ & uVar28;
      auVar238._8_4_ = local_288._8_4_ & uVar78;
      auVar238._12_4_ = local_288._12_4_ & uVar79;
      local_288 = auVar238 | auVar133;
      local_258._4_4_ = local_258._4_4_ & uVar28 | ~uVar28 & auVar215._4_4_;
      local_258._0_4_ = uVar17 & uVar27 | ~uVar27 & auVar215._0_4_;
      uStack_250._0_4_ = uVar29 & uVar78 | ~uVar78 & auVar215._8_4_;
      uStack_250._4_4_ = uVar30 & uVar79 | ~uVar79 & auVar215._12_4_;
      auVar191 = maxps(auVar184,auVar191);
      auVar191 = maxps(auVar223,auVar191);
      auVar133 = maxps(auVar218,auVar219);
      auVar223 = maxps(auVar235,auVar133);
      auVar133 = maxps(auVar217,auVar203);
      auVar133 = maxps(auVar225,auVar133);
      auVar214._0_4_ = ~uVar27 & auVar191._0_4_;
      auVar214._4_4_ = ~uVar28 & auVar191._4_4_;
      auVar214._8_4_ = ~uVar78 & auVar191._8_4_;
      auVar214._12_4_ = ~uVar79 & auVar191._12_4_;
      auVar235._0_4_ = local_248._0_4_ & uVar27;
      auVar235._4_4_ = local_248._4_4_ & uVar28;
      auVar235._8_4_ = local_248._8_4_ & uVar78;
      auVar235._12_4_ = local_248._12_4_ & uVar79;
      _local_248 = auVar235 | auVar214;
      local_2a8._4_4_ = local_2a8._4_4_ & uVar28 | ~uVar28 & auVar223._4_4_;
      local_2a8._0_4_ = uVar80 & uVar27 | ~uVar27 & auVar223._0_4_;
      local_2a8._8_4_ = uVar81 & uVar78 | ~uVar78 & auVar223._8_4_;
      local_2a8._12_4_ = uVar86 & uVar79 | ~uVar79 & auVar223._12_4_;
      auVar223._0_4_ = auVar95._0_4_ & uVar27;
      auVar223._4_4_ = auVar95._4_4_ & uVar28;
      auVar223._8_4_ = auVar95._8_4_ & uVar78;
      auVar223._12_4_ = auVar95._12_4_ & uVar79;
      auVar95._0_4_ = ~uVar27 & auVar133._0_4_;
      auVar95._4_4_ = ~uVar28 & auVar133._4_4_;
      auVar95._8_4_ = ~uVar78 & auVar133._8_4_;
      auVar95._12_4_ = ~uVar79 & auVar133._12_4_;
      auVar95 = auVar223 | auVar95;
      uVar16 = uVar16 + 4;
    }
    fVar87 = fVar87 + fVar143;
    fVar222 = fVar222 + fVar139;
    fVar228 = fVar228 + fVar156;
    fVar25 = fVar25 + fVar146;
    fVar76 = fVar76 + fVar26;
    fVar82 = fVar82 + fVar77;
    fVar146 = (fVar154 + fVar190) * 0.33333334 + fVar87;
    fVar26 = (fVar155 + fVar234) * 0.33333334 + fVar222;
    fVar77 = (fVar90 + fVar239) * 0.33333334 + fVar228;
    fVar83 = fVar25 - (fVar131 + fVar229) * 0.33333334;
    fVar24 = fVar76 - (fVar115 + fVar169) * 0.33333334;
    fVar129 = fVar82 - (fVar125 + fVar177) * 0.33333334;
    auVar55._4_4_ = local_298._0_4_;
    auVar55._0_4_ = local_298._4_4_;
    auVar55._8_4_ = local_298._12_4_;
    auVar55._12_4_ = local_298._8_4_;
    auVar191 = minps(auVar55,local_298);
    auVar106._0_8_ = auVar191._8_8_;
    auVar106._8_4_ = auVar191._0_4_;
    auVar106._12_4_ = auVar191._4_4_;
    auVar133 = minps(auVar106,auVar191);
    auVar56._4_4_ = local_288._0_4_;
    auVar56._0_4_ = local_288._4_4_;
    auVar56._8_4_ = local_288._12_4_;
    auVar56._12_4_ = local_288._8_4_;
    auVar191 = minps(auVar56,local_288);
    auVar164._0_8_ = auVar191._8_8_;
    auVar164._8_4_ = auVar191._0_4_;
    auVar164._12_4_ = auVar191._4_4_;
    auVar214 = minps(auVar164,auVar191);
    auVar57._4_4_ = uVar17;
    auVar57._0_4_ = local_258._4_4_;
    auVar57._8_4_ = uVar30;
    auVar57._12_4_ = uVar29;
    auVar191 = minps(auVar57,_local_258);
    auVar58._0_8_ = auVar191._8_8_;
    auVar58._8_4_ = auVar191._0_4_;
    auVar58._12_4_ = auVar191._4_4_;
    auVar137._4_4_ = auVar214._0_4_;
    auVar137._0_4_ = auVar133._0_4_;
    auVar59._4_4_ = local_248._0_4_;
    auVar59._0_4_ = local_248._4_4_;
    auVar59._8_4_ = local_248._12_4_;
    auVar59._12_4_ = local_248._8_4_;
    auVar133 = maxps(auVar59,_local_248);
    auVar107._0_8_ = auVar133._8_8_;
    auVar107._8_4_ = auVar133._0_4_;
    auVar107._12_4_ = auVar133._4_4_;
    auVar214 = maxps(auVar107,auVar133);
    auVar60._4_4_ = uVar80;
    auVar60._0_4_ = local_2a8._4_4_;
    auVar60._8_4_ = uVar86;
    auVar60._12_4_ = uVar81;
    auVar133 = maxps(auVar60,local_2a8);
    auVar165._0_8_ = auVar133._8_8_;
    auVar165._8_4_ = auVar133._0_4_;
    auVar165._12_4_ = auVar133._4_4_;
    auVar133 = maxps(auVar165,auVar133);
    auVar61._4_4_ = auVar95._0_4_;
    auVar61._0_4_ = auVar95._4_4_;
    auVar61._8_4_ = auVar95._12_4_;
    auVar61._12_4_ = auVar95._8_4_;
    auVar95 = maxps(auVar61,auVar95);
    auVar62._0_8_ = auVar95._8_8_;
    auVar62._8_4_ = auVar95._0_4_;
    auVar62._12_4_ = auVar95._4_4_;
    auVar153._4_4_ = auVar133._0_4_;
    auVar153._0_4_ = auVar214._0_4_;
    uVar16 = 0;
    local_288 = _DAT_01f45a40;
    _local_258 = _DAT_01f45a40;
    local_2a8._8_8_ = 0x7f8000007f800000;
    local_2a8._0_8_ = 0x7f8000007f800000;
    local_278._8_8_ = 0x7f8000007f800000;
    local_278._0_8_ = 0x7f8000007f800000;
    local_268._8_8_ = 0x7f8000007f800000;
    local_268._0_8_ = 0x7f8000007f800000;
    auVar225 = _DAT_01f45a40;
    while( true ) {
      uVar17 = local_288._0_4_;
      uVar29 = local_288._8_4_;
      uVar30 = local_288._12_4_;
      uVar80 = local_278._0_4_;
      uVar81 = local_278._8_4_;
      uVar86 = local_278._12_4_;
      if (7 < uVar16) break;
      uVar144 = (uint)uVar16;
      uVar27 = -(uint)(-0x7ffffff9 < (int)(uVar144 ^ 0x80000000));
      uVar28 = -(uint)(-0x7ffffff9 < (int)(uVar144 ^ 0x80000000));
      uVar78 = -(uint)(-0x7ffffff9 < (int)(uVar144 ^ 0x80000000));
      uVar79 = -(uint)(-0x7ffffff9 < (int)(uVar144 ^ 0x80000000));
      lVar19 = uVar16 * 4;
      fVar115 = *(float *)(bezier_basis0 + lVar19 + 0x1dc);
      fVar125 = *(float *)(bezier_basis0 + lVar19 + 0x1e0);
      fVar127 = *(float *)(bezier_basis0 + lVar19 + 0x1e4);
      fVar143 = *(float *)(bezier_basis0 + lVar19 + 0x1e8);
      lVar19 = uVar16 * 4;
      fVar131 = *(float *)(bezier_basis0 + lVar19 + 0x660);
      fVar139 = *(float *)(bezier_basis0 + lVar19 + 0x664);
      fVar141 = *(float *)(bezier_basis0 + lVar19 + 0x668);
      fVar156 = *(float *)(bezier_basis0 + lVar19 + 0x66c);
      lVar19 = uVar16 * 4;
      fVar145 = *(float *)(bezier_basis0 + lVar19 + 0xae4);
      fVar154 = *(float *)(bezier_basis0 + lVar19 + 0xae8);
      fVar155 = *(float *)(bezier_basis0 + lVar19 + 0xaec);
      fVar167 = *(float *)(bezier_basis0 + lVar19 + 0xaf0);
      lVar19 = uVar16 * 4;
      fVar90 = *(float *)(bezier_basis0 + lVar19 + 0xf68);
      fVar114 = *(float *)(bezier_basis0 + lVar19 + 0xf6c);
      fVar213 = *(float *)(bezier_basis0 + lVar19 + 0xf70);
      fVar168 = *(float *)(bezier_basis0 + lVar19 + 0xf74);
      auVar196._0_4_ = fVar87 * fVar115 + fVar146 * fVar131 + fVar83 * fVar145 + fVar25 * fVar90;
      auVar196._4_4_ = fVar87 * fVar125 + fVar146 * fVar139 + fVar83 * fVar154 + fVar25 * fVar114;
      auVar196._8_4_ = fVar87 * fVar127 + fVar146 * fVar141 + fVar83 * fVar155 + fVar25 * fVar213;
      auVar196._12_4_ = fVar87 * fVar143 + fVar146 * fVar156 + fVar83 * fVar167 + fVar25 * fVar168;
      auVar185._0_4_ = fVar222 * fVar115 + fVar26 * fVar131 + fVar24 * fVar145 + fVar76 * fVar90;
      auVar185._4_4_ = fVar222 * fVar125 + fVar26 * fVar139 + fVar24 * fVar154 + fVar76 * fVar114;
      auVar185._8_4_ = fVar222 * fVar127 + fVar26 * fVar141 + fVar24 * fVar155 + fVar76 * fVar213;
      auVar185._12_4_ = fVar222 * fVar143 + fVar26 * fVar156 + fVar24 * fVar167 + fVar76 * fVar168;
      auVar151._0_4_ = fVar115 * fVar228 + fVar131 * fVar77 + fVar145 * fVar129 + fVar90 * fVar82;
      auVar151._4_4_ = fVar125 * fVar228 + fVar139 * fVar77 + fVar154 * fVar129 + fVar114 * fVar82;
      auVar151._8_4_ = fVar127 * fVar228 + fVar141 * fVar77 + fVar155 * fVar129 + fVar213 * fVar82;
      auVar151._12_4_ = fVar143 * fVar228 + fVar156 * fVar77 + fVar167 * fVar129 + fVar168 * fVar82;
      lVar19 = uVar16 * 4;
      fVar115 = *(float *)(bezier_basis0 + lVar19 + 0x13ec);
      fVar125 = *(float *)(bezier_basis0 + lVar19 + 0x13f0);
      fVar127 = *(float *)(bezier_basis0 + lVar19 + 0x13f4);
      fVar143 = *(float *)(bezier_basis0 + lVar19 + 0x13f8);
      lVar19 = uVar16 * 4;
      fVar131 = *(float *)(bezier_basis0 + lVar19 + 0x1870);
      fVar139 = *(float *)(bezier_basis0 + lVar19 + 0x1874);
      fVar141 = *(float *)(bezier_basis0 + lVar19 + 0x1878);
      fVar156 = *(float *)(bezier_basis0 + lVar19 + 0x187c);
      lVar19 = uVar16 * 4;
      fVar145 = *(float *)(bezier_basis0 + lVar19 + 0x1cf4);
      fVar154 = *(float *)(bezier_basis0 + lVar19 + 0x1cf8);
      fVar155 = *(float *)(bezier_basis0 + lVar19 + 0x1cfc);
      fVar167 = *(float *)(bezier_basis0 + lVar19 + 0x1d00);
      lVar19 = uVar16 * 4;
      fVar90 = *(float *)(bezier_basis0 + lVar19 + 0x2178);
      fVar114 = *(float *)(bezier_basis0 + lVar19 + 0x217c);
      fVar213 = *(float *)(bezier_basis0 + lVar19 + 0x2180);
      fVar168 = *(float *)(bezier_basis0 + lVar19 + 0x2184);
      fVar176 = fVar87 * fVar115 + fVar146 * fVar131 + fVar83 * fVar145 + fVar25 * fVar90;
      fVar187 = fVar87 * fVar125 + fVar146 * fVar139 + fVar83 * fVar154 + fVar25 * fVar114;
      fVar188 = fVar87 * fVar127 + fVar146 * fVar141 + fVar83 * fVar155 + fVar25 * fVar213;
      fVar190 = fVar87 * fVar143 + fVar146 * fVar156 + fVar83 * fVar167 + fVar25 * fVar168;
      fVar234 = fVar222 * fVar115 + fVar26 * fVar131 + fVar24 * fVar145 + fVar76 * fVar90;
      fVar239 = fVar222 * fVar125 + fVar26 * fVar139 + fVar24 * fVar154 + fVar76 * fVar114;
      fVar240 = fVar222 * fVar127 + fVar26 * fVar141 + fVar24 * fVar155 + fVar76 * fVar213;
      fVar230 = fVar222 * fVar143 + fVar26 * fVar156 + fVar24 * fVar167 + fVar76 * fVar168;
      fVar115 = fVar115 * fVar228 + fVar131 * fVar77 + fVar145 * fVar129 + fVar90 * fVar82;
      fVar125 = fVar125 * fVar228 + fVar139 * fVar77 + fVar154 * fVar129 + fVar114 * fVar82;
      fVar127 = fVar127 * fVar228 + fVar141 * fVar77 + fVar155 * fVar129 + fVar213 * fVar82;
      fVar143 = fVar143 * fVar228 + fVar156 * fVar77 + fVar167 * fVar129 + fVar168 * fVar82;
      uVar84 = -(uint)(uVar144 == 0);
      uVar85 = -(uint)(uVar144 == 1);
      uVar88 = -(uint)(uVar144 == 2);
      uVar89 = -(uint)(uVar144 == 3);
      uVar132 = -(uint)(uVar144 == 7);
      uVar140 = -(uint)(uVar144 == 6);
      uVar142 = -(uint)(uVar144 == 5);
      uVar144 = -(uint)(uVar144 == 4);
      local_248._4_4_ = (float)(~uVar140 & (uint)fVar187) * 0.055555556 + auVar196._4_4_;
      local_248._0_4_ = (float)(~uVar132 & (uint)fVar176) * 0.055555556 + auVar196._0_4_;
      uStack_240._0_4_ = (uint)((float)(~uVar142 & (uint)fVar188) * 0.055555556 + auVar196._8_4_);
      uStack_240._4_4_ = (uint)((float)(~uVar144 & (uint)fVar190) * 0.055555556 + auVar196._12_4_);
      auVar133 = minps(local_2a8,auVar196);
      auVar214 = maxps(local_288,auVar196);
      auVar226._0_8_ =
           CONCAT44(auVar196._4_4_ - (float)(~uVar85 & (uint)fVar187) * 0.055555556,
                    auVar196._0_4_ - (float)(~uVar84 & (uint)fVar176) * 0.055555556);
      auVar226._8_4_ = auVar196._8_4_ - (float)(~uVar88 & (uint)fVar188) * 0.055555556;
      auVar226._12_4_ = auVar196._12_4_ - (float)(~uVar89 & (uint)fVar190) * 0.055555556;
      auVar197._0_4_ = (float)(~uVar132 & (uint)fVar234) * 0.055555556 + auVar185._0_4_;
      auVar197._4_4_ = (float)(~uVar140 & (uint)fVar239) * 0.055555556 + auVar185._4_4_;
      auVar197._8_4_ = (float)(~uVar142 & (uint)fVar240) * 0.055555556 + auVar185._8_4_;
      auVar197._12_4_ = (float)(~uVar144 & (uint)fVar230) * 0.055555556 + auVar185._12_4_;
      auVar217 = minps(local_278,auVar185);
      auVar215 = maxps(_local_258,auVar185);
      auVar186._0_8_ =
           CONCAT44(auVar185._4_4_ - (float)(~uVar85 & (uint)fVar239) * 0.055555556,
                    auVar185._0_4_ - (float)(~uVar84 & (uint)fVar234) * 0.055555556);
      auVar186._8_4_ = auVar185._8_4_ - (float)(~uVar88 & (uint)fVar240) * 0.055555556;
      auVar186._12_4_ = auVar185._12_4_ - (float)(~uVar89 & (uint)fVar230) * 0.055555556;
      auVar63._0_4_ = (float)(~uVar132 & (uint)fVar115) * 0.055555556 + auVar151._0_4_;
      auVar63._4_4_ = (float)(~uVar140 & (uint)fVar125) * 0.055555556 + auVar151._4_4_;
      auVar63._8_4_ = (float)(~uVar142 & (uint)fVar127) * 0.055555556 + auVar151._8_4_;
      auVar63._12_4_ = (float)(~uVar144 & (uint)fVar143) * 0.055555556 + auVar151._12_4_;
      auVar218 = minps(local_268,auVar151);
      auVar223 = maxps(auVar225,auVar151);
      auVar152._0_8_ =
           CONCAT44(auVar151._4_4_ - (float)(~uVar85 & (uint)fVar125) * 0.055555556,
                    auVar151._0_4_ - (float)(~uVar84 & (uint)fVar115) * 0.055555556);
      auVar152._8_4_ = auVar151._8_4_ - (float)(~uVar88 & (uint)fVar127) * 0.055555556;
      auVar152._12_4_ = auVar151._12_4_ - (float)(~uVar89 & (uint)fVar143) * 0.055555556;
      auVar173._8_4_ = auVar226._8_4_;
      auVar173._0_8_ = auVar226._0_8_;
      auVar173._12_4_ = auVar226._12_4_;
      auVar235 = minps(auVar173,_local_248);
      auVar235 = minps(auVar133,auVar235);
      auVar174._8_4_ = auVar186._8_4_;
      auVar174._0_8_ = auVar186._0_8_;
      auVar174._12_4_ = auVar186._12_4_;
      auVar133 = minps(auVar174,auVar197);
      auVar133 = minps(auVar217,auVar133);
      auVar175._8_4_ = auVar152._8_4_;
      auVar175._0_8_ = auVar152._0_8_;
      auVar175._12_4_ = auVar152._12_4_;
      auVar217 = minps(auVar175,auVar63);
      auVar217 = minps(auVar218,auVar217);
      auVar64._0_4_ = ~uVar27 & auVar235._0_4_;
      auVar64._4_4_ = ~uVar28 & auVar235._4_4_;
      auVar64._8_4_ = ~uVar78 & auVar235._8_4_;
      auVar64._12_4_ = ~uVar79 & auVar235._12_4_;
      auVar216._0_4_ = local_2a8._0_4_ & uVar27;
      auVar216._4_4_ = local_2a8._4_4_ & uVar28;
      auVar216._8_4_ = local_2a8._8_4_ & uVar78;
      auVar216._12_4_ = local_2a8._12_4_ & uVar79;
      local_2a8 = auVar216 | auVar64;
      local_278._4_4_ = local_278._4_4_ & uVar28 | ~uVar28 & auVar133._4_4_;
      local_278._0_4_ = uVar80 & uVar27 | ~uVar27 & auVar133._0_4_;
      local_278._8_4_ = uVar81 & uVar78 | ~uVar78 & auVar133._8_4_;
      local_278._12_4_ = uVar86 & uVar79 | ~uVar79 & auVar133._12_4_;
      auVar65._0_4_ = ~uVar27 & auVar217._0_4_;
      auVar65._4_4_ = ~uVar28 & auVar217._4_4_;
      auVar65._8_4_ = ~uVar78 & auVar217._8_4_;
      auVar65._12_4_ = ~uVar79 & auVar217._12_4_;
      auVar220._0_4_ = local_268._0_4_ & uVar27;
      auVar220._4_4_ = local_268._4_4_ & uVar28;
      auVar220._8_4_ = local_268._8_4_ & uVar78;
      auVar220._12_4_ = local_268._12_4_ & uVar79;
      local_268 = auVar220 | auVar65;
      auVar133 = maxps(auVar226,_local_248);
      auVar133 = maxps(auVar214,auVar133);
      auVar214 = maxps(auVar186,auVar197);
      auVar217 = maxps(auVar215,auVar214);
      auVar214 = maxps(auVar152,auVar63);
      auVar214 = maxps(auVar223,auVar214);
      local_288._4_4_ = local_288._4_4_ & uVar28 | ~uVar28 & auVar133._4_4_;
      local_288._0_4_ = uVar17 & uVar27 | ~uVar27 & auVar133._0_4_;
      local_288._8_4_ = uVar29 & uVar78 | ~uVar78 & auVar133._8_4_;
      local_288._12_4_ = uVar30 & uVar79 | ~uVar79 & auVar133._12_4_;
      auVar66._0_4_ = ~uVar27 & auVar217._0_4_;
      auVar66._4_4_ = ~uVar28 & auVar217._4_4_;
      auVar66._8_4_ = ~uVar78 & auVar217._8_4_;
      auVar66._12_4_ = ~uVar79 & auVar217._12_4_;
      auVar166._0_4_ = local_258._0_4_ & uVar27;
      auVar166._4_4_ = local_258._4_4_ & uVar28;
      auVar166._8_4_ = local_258._8_4_ & uVar78;
      auVar166._12_4_ = local_258._12_4_ & uVar79;
      _local_258 = auVar166 | auVar66;
      auVar136._0_4_ = auVar225._0_4_ & uVar27;
      auVar136._4_4_ = auVar225._4_4_ & uVar28;
      auVar136._8_4_ = auVar225._8_4_ & uVar78;
      auVar136._12_4_ = auVar225._12_4_ & uVar79;
      auVar225._0_4_ = ~uVar27 & auVar214._0_4_;
      auVar225._4_4_ = ~uVar28 & auVar214._4_4_;
      auVar225._8_4_ = ~uVar78 & auVar214._8_4_;
      auVar225._12_4_ = ~uVar79 & auVar214._12_4_;
      auVar225 = auVar136 | auVar225;
      uVar16 = uVar16 + 4;
    }
    auVar191 = minps(auVar58,auVar191);
    auVar137._8_4_ = auVar191._0_4_;
    auVar137._12_4_ = 0;
    auVar95 = maxps(auVar62,auVar95);
    auVar153._8_4_ = auVar95._0_4_;
    auVar153._12_4_ = 0;
    auVar67._4_4_ = local_2a8._0_4_;
    auVar67._0_4_ = local_2a8._4_4_;
    auVar67._8_4_ = local_2a8._12_4_;
    auVar67._12_4_ = local_2a8._8_4_;
    auVar95 = minps(auVar67,local_2a8);
    auVar108._0_8_ = auVar95._8_8_;
    auVar108._8_4_ = auVar95._0_4_;
    auVar108._12_4_ = auVar95._4_4_;
    auVar191 = minps(auVar108,auVar95);
    auVar68._4_4_ = uVar80;
    auVar68._0_4_ = local_278._4_4_;
    auVar68._8_4_ = uVar86;
    auVar68._12_4_ = uVar81;
    auVar95 = minps(auVar68,local_278);
    auVar121._0_8_ = auVar95._8_8_;
    auVar121._8_4_ = auVar95._0_4_;
    auVar121._12_4_ = auVar95._4_4_;
    auVar133 = minps(auVar121,auVar95);
    auVar69._4_4_ = local_268._0_4_;
    auVar69._0_4_ = local_268._4_4_;
    auVar69._8_4_ = local_268._12_4_;
    auVar69._12_4_ = local_268._8_4_;
    auVar95 = minps(auVar69,local_268);
    auVar109._0_8_ = auVar95._8_8_;
    auVar109._8_4_ = auVar95._0_4_;
    auVar109._12_4_ = auVar95._4_4_;
    auVar95 = minps(auVar109,auVar95);
    auVar122._4_4_ = auVar133._0_4_;
    auVar122._0_4_ = auVar191._0_4_;
    auVar122._8_4_ = auVar95._0_4_;
    auVar122._12_4_ = 0;
    auVar214 = minps(auVar137,auVar122);
    auVar70._4_4_ = uVar17;
    auVar70._0_4_ = local_288._4_4_;
    auVar70._8_4_ = uVar30;
    auVar70._12_4_ = uVar29;
    auVar95 = maxps(auVar70,local_288);
    auVar110._0_8_ = auVar95._8_8_;
    auVar110._8_4_ = auVar95._0_4_;
    auVar110._12_4_ = auVar95._4_4_;
    auVar191 = maxps(auVar110,auVar95);
    auVar71._4_4_ = local_258._0_4_;
    auVar71._0_4_ = local_258._4_4_;
    auVar71._8_4_ = local_258._12_4_;
    auVar71._12_4_ = local_258._8_4_;
    auVar95 = maxps(auVar71,_local_258);
    auVar123._0_8_ = auVar95._8_8_;
    auVar123._8_4_ = auVar95._0_4_;
    auVar123._12_4_ = auVar95._4_4_;
    auVar133 = maxps(auVar123,auVar95);
    auVar72._4_4_ = auVar225._0_4_;
    auVar72._0_4_ = auVar225._4_4_;
    auVar72._8_4_ = auVar225._12_4_;
    auVar72._12_4_ = auVar225._8_4_;
    auVar95 = maxps(auVar72,auVar225);
    auVar111._0_8_ = auVar95._8_8_;
    auVar111._8_4_ = auVar95._0_4_;
    auVar111._12_4_ = auVar95._4_4_;
    auVar95 = maxps(auVar111,auVar95);
    auVar124._4_4_ = auVar133._0_4_;
    auVar124._0_4_ = auVar191._0_4_;
    auVar124._8_4_ = auVar95._0_4_;
    auVar124._12_4_ = 0;
    auVar191 = maxps(auVar153,auVar124);
    auVar73._0_8_ = auVar214._0_8_ & 0x7fffffff7fffffff;
    auVar73._8_4_ = ABS(auVar214._8_4_);
    auVar73._12_4_ = auVar214._12_4_ & 0x7fffffff;
    auVar112._0_8_ = auVar191._0_8_ & 0x7fffffff7fffffff;
    auVar112._8_4_ = ABS(auVar191._8_4_);
    auVar112._12_4_ = auVar191._12_4_ & 0x7fffffff;
    auVar95 = maxps(auVar73,auVar112);
    fVar146 = auVar95._4_4_;
    if (auVar95._4_4_ <= auVar95._0_4_) {
      fVar146 = auVar95._0_4_;
    }
    auVar74._8_8_ = auVar95._8_8_;
    auVar74._0_8_ = auVar95._8_8_;
    if (auVar95._8_4_ <= fVar146) {
      auVar74._0_4_ = fVar146;
    }
    fVar146 = auVar74._0_4_ * 4.7683716e-07;
    aVar138._0_4_ = auVar214._0_4_ - fVar146;
    aVar138._4_4_ = auVar214._4_4_ - fVar146;
    aVar138._8_4_ = auVar214._8_4_ - fVar146;
    aVar75._0_4_ = fVar146 + auVar191._0_4_;
    aVar75._4_4_ = fVar146 + auVar191._4_4_;
    aVar75._8_4_ = fVar146 + auVar191._8_4_;
    aVar138.m128[3] = (float)geomID;
    aVar75.m128[3] = (float)uVar20;
    auVar113._0_4_ = aVar138._0_4_ + aVar75._0_4_;
    auVar113._4_4_ = aVar138._4_4_ + aVar75._4_4_;
    auVar113._8_4_ = aVar138._8_4_ + aVar75._8_4_;
    auVar113._12_4_ = (float)geomID + (float)uVar20;
    local_98 = minps(local_98,auVar113);
    local_88 = maxps(local_88,auVar113);
    local_b8 = minps(local_b8,(undefined1  [16])aVar138);
    prims[local_c0].lower.field_0 = aVar138;
    local_a8 = maxps(local_a8,(undefined1  [16])aVar75);
    prims[local_c0].upper.field_0 = aVar75;
    local_c8 = local_c8 + 1;
    local_c0 = local_c0 + 1;
  }
  else {
    pcVar7 = pBVar5[lVar19].super_RawBufferView.ptr_ofs;
    sVar8 = pBVar5[lVar19].super_RawBufferView.stride;
    lVar14 = sVar8 * uVar16;
    lVar12 = sVar8 * uVar23;
    auVar31._4_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar7 + sVar8 * uVar22 + 0xc)));
    auVar31._0_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar7 + lVar14 + 0xc)));
    auVar31._8_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar7 + lVar12 + 0xc)));
    auVar31._12_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar7 + sVar8 * uVar21 + 0xc)));
    uVar17 = movmskps((int)pCVar18,auVar31);
    pCVar18 = (CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
               *)(ulong)uVar17;
    if (uVar17 == 0) {
      pfVar1 = (float *)(pcVar7 + lVar14);
      fVar26 = *pfVar1;
      fVar77 = pfVar1[1];
      fVar83 = pfVar1[2];
      fVar24 = pfVar1[3];
      auVar91._0_4_ = -(uint)(fVar26 < 1.844e+18 && -1.844e+18 < fVar26);
      auVar91._4_4_ = -(uint)(fVar77 < 1.844e+18 && -1.844e+18 < fVar77);
      auVar91._8_4_ = -(uint)(fVar83 < 1.844e+18 && -1.844e+18 < fVar83);
      auVar91._12_4_ = -(uint)(fVar24 < 1.844e+18 && -1.844e+18 < fVar24);
      uVar13 = movmskps((int)lVar14,auVar91);
      if ((~(byte)uVar13 & 7) == 0) {
        auVar95 = *(undefined1 (*) [16])(pcVar7 + sVar8 * uVar22);
        fVar115 = auVar95._0_4_;
        fVar125 = auVar95._4_4_;
        fVar127 = auVar95._8_4_;
        fVar129 = auVar95._12_4_;
        auVar92._0_4_ = -(uint)(fVar115 < 1.844e+18 && -1.844e+18 < fVar115);
        auVar92._4_4_ = -(uint)(fVar125 < 1.844e+18 && -1.844e+18 < fVar125);
        auVar92._8_4_ = -(uint)(fVar127 < 1.844e+18 && -1.844e+18 < fVar127);
        auVar92._12_4_ = -(uint)(fVar129 < 1.844e+18 && -1.844e+18 < fVar129);
        uVar13 = movmskps(CONCAT31((int3)((uint)uVar13 >> 8),~(byte)uVar13),auVar92);
        if ((~(byte)uVar13 & 7) == 0) {
          auVar95 = *(undefined1 (*) [16])(pcVar7 + lVar12);
          fVar131 = auVar95._0_4_;
          fVar139 = auVar95._4_4_;
          fVar141 = auVar95._8_4_;
          fVar143 = auVar95._12_4_;
          auVar93._0_4_ = -(uint)(fVar131 < 1.844e+18 && -1.844e+18 < fVar131);
          auVar93._4_4_ = -(uint)(fVar139 < 1.844e+18 && -1.844e+18 < fVar139);
          auVar93._8_4_ = -(uint)(fVar141 < 1.844e+18 && -1.844e+18 < fVar141);
          auVar93._12_4_ = -(uint)(fVar143 < 1.844e+18 && -1.844e+18 < fVar143);
          uVar13 = movmskps((int)lVar12,auVar93);
          if ((~(byte)uVar13 & 7) == 0) {
            auVar95 = *(undefined1 (*) [16])(pcVar7 + sVar8 * uVar21);
            fVar145 = auVar95._0_4_;
            fVar154 = auVar95._4_4_;
            fVar155 = auVar95._8_4_;
            fVar156 = auVar95._12_4_;
            auVar94._0_4_ = -(uint)(fVar145 < 1.844e+18 && -1.844e+18 < fVar145);
            auVar94._4_4_ = -(uint)(fVar154 < 1.844e+18 && -1.844e+18 < fVar154);
            auVar94._8_4_ = -(uint)(fVar155 < 1.844e+18 && -1.844e+18 < fVar155);
            auVar94._12_4_ = -(uint)(fVar156 < 1.844e+18 && -1.844e+18 < fVar156);
            uVar13 = movmskps(CONCAT31((int3)((uint)uVar13 >> 8),~(byte)uVar13),auVar94);
            if ((~(byte)uVar13 & 7) == 0) {
              pcVar7 = pBVar6[lVar19].super_RawBufferView.ptr_ofs;
              sVar8 = pBVar6[lVar19].super_RawBufferView.stride;
              auVar95 = *(undefined1 (*) [16])(pcVar7 + sVar8 * uVar16);
              fVar90 = auVar95._0_4_;
              fVar114 = auVar95._4_4_;
              fVar167 = auVar95._8_4_;
              auVar157._0_4_ = -(uint)(fVar90 < 1.844e+18 && -1.844e+18 < fVar90);
              auVar157._4_4_ = -(uint)(fVar114 < 1.844e+18 && -1.844e+18 < fVar114);
              auVar157._8_4_ = -(uint)(fVar167 < 1.844e+18 && -1.844e+18 < fVar167);
              auVar157._12_4_ = -(uint)(auVar95._12_4_ < 1.844e+18 && -1.844e+18 < auVar95._12_4_);
              uVar13 = movmskps((int)(sVar8 * uVar16),auVar157);
              if ((~(byte)uVar13 & 7) == 0) {
                auVar95 = *(undefined1 (*) [16])(pcVar7 + sVar8 * uVar22);
                fVar168 = auVar95._0_4_;
                fVar176 = auVar95._4_4_;
                fVar213 = auVar95._8_4_;
                auVar158._0_4_ = -(uint)(fVar168 < 1.844e+18 && -1.844e+18 < fVar168);
                auVar158._4_4_ = -(uint)(fVar176 < 1.844e+18 && -1.844e+18 < fVar176);
                auVar158._8_4_ = -(uint)(fVar213 < 1.844e+18 && -1.844e+18 < fVar213);
                auVar158._12_4_ = -(uint)(auVar95._12_4_ < 1.844e+18 && -1.844e+18 < auVar95._12_4_)
                ;
                uVar13 = movmskps((int)(sVar8 * uVar22),auVar158);
                if ((~(byte)uVar13 & 7) == 0) goto code_r0x00243b44;
              }
            }
          }
        }
      }
    }
  }
  goto LAB_002449f1;
code_r0x00243b44:
  fVar24 = fVar24 * fVar146;
  fVar129 = fVar129 * fVar146;
  fVar143 = fVar143 * fVar146;
  fVar156 = fVar156 * fVar146;
  pfVar1 = (float *)(pcVar7 + sVar8 * uVar23);
  fVar187 = *pfVar1;
  fVar188 = pfVar1[1];
  fVar190 = pfVar1[2];
  pfVar1 = (float *)(pcVar7 + sVar8 * uVar21);
  fVar234 = *pfVar1;
  fVar239 = pfVar1[1];
  fVar240 = pfVar1[2];
  fVar25 = (fVar131 * 0.5 + fVar145 * 0.0 + fVar115 * 0.0) - fVar26 * 0.5;
  fVar76 = (fVar139 * 0.5 + fVar154 * 0.0 + fVar125 * 0.0) - fVar77 * 0.5;
  fVar82 = (fVar141 * 0.5 + fVar155 * 0.0 + fVar127 * 0.0) - fVar83 * 0.5;
  fVar87 = (fVar143 * 0.5 + fVar156 * 0.0 + fVar129 * 0.0) - fVar24 * 0.5;
  fVar189 = (fVar187 * 0.5 + fVar234 * 0.0 + fVar168 * 0.0) - fVar90 * 0.5;
  fVar198 = (fVar188 * 0.5 + fVar239 * 0.0 + fVar176 * 0.0) - fVar114 * 0.5;
  fVar199 = (fVar190 * 0.5 + fVar240 * 0.0 + fVar213 * 0.0) - fVar167 * 0.5;
  fVar221 = fVar131 * 0.0 + fVar145 * -0.0 + fVar115 + fVar26 * -0.0;
  fVar227 = fVar139 * 0.0 + fVar154 * -0.0 + fVar125 + fVar77 * -0.0;
  fVar229 = fVar141 * 0.0 + fVar155 * -0.0 + fVar127 + fVar83 * -0.0;
  fVar231 = fVar143 * 0.0 + fVar156 * -0.0 + fVar129 + fVar24 * -0.0;
  fVar207 = fVar187 * 0.0 + fVar234 * -0.0 + fVar168 + fVar90 * -0.0;
  fVar211 = fVar188 * 0.0 + fVar239 * -0.0 + fVar176 + fVar114 * -0.0;
  fVar212 = fVar190 * 0.0 + fVar240 * -0.0 + fVar213 + fVar167 * -0.0;
  fVar222 = fVar145 * -0.0 + fVar131 + fVar115 * 0.0 + fVar26 * -0.0;
  fVar228 = fVar154 * -0.0 + fVar139 + fVar125 * 0.0 + fVar77 * -0.0;
  fVar230 = fVar155 * -0.0 + fVar141 + fVar127 * 0.0 + fVar83 * -0.0;
  fVar232 = fVar156 * -0.0 + fVar143 + fVar129 * 0.0 + fVar24 * -0.0;
  fVar169 = fVar26 * 0.0 + ((fVar145 * 0.5 + fVar131 * 0.0) - fVar115 * 0.5);
  fVar177 = fVar77 * 0.0 + ((fVar154 * 0.5 + fVar139 * 0.0) - fVar125 * 0.5);
  fVar178 = fVar83 * 0.0 + ((fVar155 * 0.5 + fVar141 * 0.0) - fVar127 * 0.5);
  fVar179 = fVar24 * 0.0 + ((fVar156 * 0.5 + fVar143 * 0.0) - fVar129 * 0.5);
  fVar24 = fVar234 * -0.0 + fVar187 + fVar168 * 0.0 + fVar90 * -0.0;
  fVar129 = fVar239 * -0.0 + fVar188 + fVar176 * 0.0 + fVar114 * -0.0;
  fVar115 = fVar240 * -0.0 + fVar190 + fVar213 * 0.0 + fVar167 * -0.0;
  fVar26 = fVar90 * 0.0 + ((fVar234 * 0.5 + fVar187 * 0.0) - fVar168 * 0.5);
  fVar77 = fVar114 * 0.0 + ((fVar239 * 0.5 + fVar188 * 0.0) - fVar176 * 0.5);
  fVar83 = fVar167 * 0.0 + ((fVar240 * 0.5 + fVar190 * 0.0) - fVar213 * 0.5);
  fVar168 = fVar207 * fVar76 - fVar211 * fVar25;
  fVar114 = fVar211 * fVar82 - fVar212 * fVar76;
  fVar213 = fVar212 * fVar25 - fVar207 * fVar82;
  fVar127 = fVar76 * fVar189 - fVar198 * fVar25;
  fVar143 = fVar82 * fVar198 - fVar199 * fVar76;
  fVar131 = fVar25 * fVar199 - fVar189 * fVar82;
  fVar139 = fVar24 * fVar177 - fVar129 * fVar169;
  fVar145 = fVar129 * fVar178 - fVar115 * fVar177;
  fVar155 = fVar115 * fVar169 - fVar24 * fVar178;
  fVar24 = fVar177 * fVar26 - fVar77 * fVar169;
  fVar115 = fVar178 * fVar77 - fVar83 * fVar177;
  fVar125 = fVar169 * fVar83 - fVar26 * fVar178;
  fVar77 = fVar213 * fVar213 + fVar114 * fVar114 + fVar168 * fVar168;
  auVar191 = ZEXT416((uint)fVar77);
  auVar95 = rsqrtss(ZEXT416((uint)fVar77),auVar191);
  fVar26 = auVar95._0_4_;
  fVar83 = fVar26 * 1.5 - fVar26 * fVar26 * fVar77 * 0.5 * fVar26;
  fVar176 = fVar168 * fVar127 + fVar213 * fVar131 + fVar114 * fVar143;
  auVar95 = rcpss(auVar191,auVar191);
  fVar26 = (2.0 - fVar77 * auVar95._0_4_) * auVar95._0_4_;
  fVar90 = fVar155 * fVar155 + fVar145 * fVar145 + fVar139 * fVar139;
  auVar95 = ZEXT416((uint)fVar90);
  auVar191 = rsqrtss(ZEXT416((uint)fVar90),auVar95);
  fVar129 = auVar191._0_4_;
  fVar141 = fVar129 * 1.5 - fVar129 * fVar129 * fVar90 * 0.5 * fVar129;
  fVar190 = fVar139 * fVar24 + fVar155 * fVar125 + fVar145 * fVar115;
  auVar95 = rcpss(auVar95,auVar95);
  fVar129 = (2.0 - fVar90 * auVar95._0_4_) * auVar95._0_4_;
  fVar156 = fVar231 * fVar114 * fVar83;
  fVar154 = fVar231 * fVar213 * fVar83;
  fVar167 = fVar231 * fVar168 * fVar83;
  fVar234 = fVar221 - fVar156;
  fVar239 = fVar227 - fVar154;
  fVar240 = fVar229 - fVar167;
  fVar114 = fVar231 * fVar26 * (fVar77 * fVar143 - fVar176 * fVar114) * fVar83 +
            fVar87 * fVar114 * fVar83;
  fVar213 = fVar231 * fVar26 * (fVar77 * fVar131 - fVar176 * fVar213) * fVar83 +
            fVar87 * fVar213 * fVar83;
  fVar168 = fVar231 * fVar26 * (fVar77 * fVar127 - fVar176 * fVar168) * fVar83 +
            fVar87 * fVar168 * fVar83;
  fVar26 = fVar232 * fVar145 * fVar141;
  fVar77 = fVar232 * fVar155 * fVar141;
  fVar83 = fVar232 * fVar139 * fVar141;
  fVar176 = fVar222 - fVar26;
  fVar187 = fVar228 - fVar77;
  fVar188 = fVar230 - fVar83;
  fVar127 = fVar232 * fVar129 * (fVar90 * fVar115 - fVar190 * fVar145) * fVar141 +
            fVar179 * fVar145 * fVar141;
  fVar125 = fVar232 * fVar129 * (fVar90 * fVar125 - fVar190 * fVar155) * fVar141 +
            fVar179 * fVar155 * fVar141;
  fVar143 = fVar232 * fVar129 * (fVar90 * fVar24 - fVar190 * fVar139) * fVar141 +
            fVar179 * fVar139 * fVar141;
  fVar131 = (fVar25 - fVar114) * 0.33333334 + fVar234;
  fVar139 = (fVar76 - fVar213) * 0.33333334 + fVar239;
  fVar141 = (fVar82 - fVar168) * 0.33333334 + fVar240;
  fVar24 = fVar176 - (fVar169 - fVar127) * 0.33333334;
  fVar129 = fVar187 - (fVar177 - fVar125) * 0.33333334;
  fVar115 = fVar188 - (fVar178 - fVar143) * 0.33333334;
  uVar15 = 0;
  local_2a8 = _DAT_01f45a40;
  local_288 = _DAT_01f45a40;
  uStack_240 = 0x7f8000007f800000;
  local_248 = (undefined1  [8])0x7f8000007f800000;
  local_278._8_8_ = 0x7f8000007f800000;
  local_278._0_8_ = 0x7f8000007f800000;
  local_268._8_8_ = 0x7f8000007f800000;
  local_268._0_8_ = 0x7f8000007f800000;
  auVar209 = _DAT_01f45a40;
  while( true ) {
    uVar17 = local_268._0_4_;
    uVar29 = local_268._8_4_;
    uVar30 = local_268._12_4_;
    uVar80 = local_278._0_4_;
    uVar81 = local_278._8_4_;
    uVar86 = local_278._12_4_;
    if (7 < uVar15) break;
    uVar144 = (uint)uVar15;
    uVar27 = -(uint)(-0x7ffffff9 < (int)(uVar144 ^ 0x80000000));
    uVar78 = -(uint)(-0x7ffffff9 < (int)(uVar144 ^ 0x80000000));
    uVar84 = -(uint)(-0x7ffffff9 < (int)(uVar144 ^ 0x80000000));
    uVar88 = -(uint)(-0x7ffffff9 < (int)(uVar144 ^ 0x80000000));
    lVar12 = uVar15 * 4;
    fVar145 = *(float *)(bezier_basis0 + lVar12 + 0x1dc);
    fVar155 = *(float *)(bezier_basis0 + lVar12 + 0x1e0);
    fVar90 = *(float *)(bezier_basis0 + lVar12 + 0x1e4);
    fVar190 = *(float *)(bezier_basis0 + lVar12 + 0x1e8);
    lVar12 = uVar15 * 4;
    fVar87 = *(float *)(bezier_basis0 + lVar12 + 0x660);
    fVar179 = *(float *)(bezier_basis0 + lVar12 + 0x664);
    fVar189 = *(float *)(bezier_basis0 + lVar12 + 0x668);
    fVar198 = *(float *)(bezier_basis0 + lVar12 + 0x66c);
    lVar12 = uVar15 * 4;
    fVar199 = *(float *)(bezier_basis0 + lVar12 + 0xae4);
    fVar207 = *(float *)(bezier_basis0 + lVar12 + 0xae8);
    fVar211 = *(float *)(bezier_basis0 + lVar12 + 0xaec);
    fVar212 = *(float *)(bezier_basis0 + lVar12 + 0xaf0);
    lVar12 = uVar15 * 4;
    fVar231 = *(float *)(bezier_basis0 + lVar12 + 0xf68);
    fVar232 = *(float *)(bezier_basis0 + lVar12 + 0xf6c);
    fVar9 = *(float *)(bezier_basis0 + lVar12 + 0xf70);
    fVar180 = *(float *)(bezier_basis0 + lVar12 + 0xf74);
    auVar147._0_4_ = fVar234 * fVar145 + fVar131 * fVar87 + fVar24 * fVar199 + fVar176 * fVar231;
    auVar147._4_4_ = fVar234 * fVar155 + fVar131 * fVar179 + fVar24 * fVar207 + fVar176 * fVar232;
    auVar147._8_4_ = fVar234 * fVar90 + fVar131 * fVar189 + fVar24 * fVar211 + fVar176 * fVar9;
    auVar147._12_4_ = fVar234 * fVar190 + fVar131 * fVar198 + fVar24 * fVar212 + fVar176 * fVar180;
    auVar159._0_4_ = fVar239 * fVar145 + fVar139 * fVar87 + fVar129 * fVar199 + fVar187 * fVar231;
    auVar159._4_4_ = fVar239 * fVar155 + fVar139 * fVar179 + fVar129 * fVar207 + fVar187 * fVar232;
    auVar159._8_4_ = fVar239 * fVar90 + fVar139 * fVar189 + fVar129 * fVar211 + fVar187 * fVar9;
    auVar159._12_4_ = fVar239 * fVar190 + fVar139 * fVar198 + fVar129 * fVar212 + fVar187 * fVar180;
    local_108._0_4_ = fVar145 * fVar240 + fVar87 * fVar141 + fVar199 * fVar115 + fVar231 * fVar188;
    local_108._4_4_ = fVar155 * fVar240 + fVar179 * fVar141 + fVar207 * fVar115 + fVar232 * fVar188;
    fStack_100 = fVar90 * fVar240 + fVar189 * fVar141 + fVar211 * fVar115 + fVar9 * fVar188;
    fStack_fc = fVar190 * fVar240 + fVar198 * fVar141 + fVar212 * fVar115 + fVar180 * fVar188;
    lVar12 = uVar15 * 4;
    fVar145 = *(float *)(bezier_basis0 + lVar12 + 0x13ec);
    fVar155 = *(float *)(bezier_basis0 + lVar12 + 0x13f0);
    fVar90 = *(float *)(bezier_basis0 + lVar12 + 0x13f4);
    fVar190 = *(float *)(bezier_basis0 + lVar12 + 0x13f8);
    lVar12 = uVar15 * 4;
    fVar87 = *(float *)(bezier_basis0 + lVar12 + 0x1870);
    fVar179 = *(float *)(bezier_basis0 + lVar12 + 0x1874);
    fVar189 = *(float *)(bezier_basis0 + lVar12 + 0x1878);
    fVar198 = *(float *)(bezier_basis0 + lVar12 + 0x187c);
    lVar12 = uVar15 * 4;
    fVar199 = *(float *)(bezier_basis0 + lVar12 + 0x1cf4);
    fVar207 = *(float *)(bezier_basis0 + lVar12 + 0x1cf8);
    fVar211 = *(float *)(bezier_basis0 + lVar12 + 0x1cfc);
    fVar212 = *(float *)(bezier_basis0 + lVar12 + 0x1d00);
    lVar12 = uVar15 * 4;
    fVar231 = *(float *)(bezier_basis0 + lVar12 + 0x2178);
    fVar232 = *(float *)(bezier_basis0 + lVar12 + 0x217c);
    fVar9 = *(float *)(bezier_basis0 + lVar12 + 0x2180);
    fVar180 = *(float *)(bezier_basis0 + lVar12 + 0x2184);
    fVar116 = fVar234 * fVar145 + fVar131 * fVar87 + fVar24 * fVar199 + fVar176 * fVar231;
    fVar126 = fVar234 * fVar155 + fVar131 * fVar179 + fVar24 * fVar207 + fVar176 * fVar232;
    fVar128 = fVar234 * fVar90 + fVar131 * fVar189 + fVar24 * fVar211 + fVar176 * fVar9;
    fVar130 = fVar234 * fVar190 + fVar131 * fVar198 + fVar24 * fVar212 + fVar176 * fVar180;
    fVar200 = fVar239 * fVar145 + fVar139 * fVar87 + fVar129 * fVar199 + fVar187 * fVar231;
    fVar204 = fVar239 * fVar155 + fVar139 * fVar179 + fVar129 * fVar207 + fVar187 * fVar232;
    fVar205 = fVar239 * fVar90 + fVar139 * fVar189 + fVar129 * fVar211 + fVar187 * fVar9;
    fVar206 = fVar239 * fVar190 + fVar139 * fVar198 + fVar129 * fVar212 + fVar187 * fVar180;
    fVar145 = fVar145 * fVar240 + fVar87 * fVar141 + fVar199 * fVar115 + fVar231 * fVar188;
    fVar155 = fVar155 * fVar240 + fVar179 * fVar141 + fVar207 * fVar115 + fVar232 * fVar188;
    fVar90 = fVar90 * fVar240 + fVar189 * fVar141 + fVar211 * fVar115 + fVar9 * fVar188;
    fVar190 = fVar190 * fVar240 + fVar198 * fVar141 + fVar212 * fVar115 + fVar180 * fVar188;
    uVar28 = -(uint)(uVar144 == 0);
    uVar79 = -(uint)(uVar144 == 1);
    uVar85 = -(uint)(uVar144 == 2);
    uVar89 = -(uint)(uVar144 == 3);
    uVar132 = -(uint)(uVar144 == 7);
    uVar140 = -(uint)(uVar144 == 6);
    uVar142 = -(uint)(uVar144 == 5);
    uVar144 = -(uint)(uVar144 == 4);
    local_258._4_4_ = (float)(~uVar140 & (uint)fVar126) * 0.055555556 + auVar147._4_4_;
    local_258._0_4_ = (float)(~uVar132 & (uint)fVar116) * 0.055555556 + auVar147._0_4_;
    uStack_250._0_4_ = (float)(~uVar142 & (uint)fVar128) * 0.055555556 + auVar147._8_4_;
    uStack_250._4_4_ = (float)(~uVar144 & (uint)fVar130) * 0.055555556 + auVar147._12_4_;
    auVar235 = minps(_local_248,auVar147);
    auVar223 = maxps(local_2a8,auVar147);
    auVar192._0_8_ =
         CONCAT44(auVar147._4_4_ - (float)(~uVar79 & (uint)fVar126) * 0.055555556,
                  auVar147._0_4_ - (float)(~uVar28 & (uint)fVar116) * 0.055555556);
    auVar192._8_4_ = auVar147._8_4_ - (float)(~uVar85 & (uint)fVar128) * 0.055555556;
    auVar192._12_4_ = auVar147._12_4_ - (float)(~uVar89 & (uint)fVar130) * 0.055555556;
    auVar148._0_4_ = (float)(~uVar132 & (uint)fVar200) * 0.055555556 + auVar159._0_4_;
    auVar148._4_4_ = (float)(~uVar140 & (uint)fVar204) * 0.055555556 + auVar159._4_4_;
    auVar148._8_4_ = (float)(~uVar142 & (uint)fVar205) * 0.055555556 + auVar159._8_4_;
    auVar148._12_4_ = (float)(~uVar144 & (uint)fVar206) * 0.055555556 + auVar159._12_4_;
    auVar133 = minps(local_278,auVar159);
    auVar217 = maxps(local_288,auVar159);
    auVar160._0_8_ =
         CONCAT44(auVar159._4_4_ - (float)(~uVar79 & (uint)fVar204) * 0.055555556,
                  auVar159._0_4_ - (float)(~uVar28 & (uint)fVar200) * 0.055555556);
    auVar160._8_4_ = auVar159._8_4_ - (float)(~uVar85 & (uint)fVar205) * 0.055555556;
    auVar160._12_4_ = auVar159._12_4_ - (float)(~uVar89 & (uint)fVar206) * 0.055555556;
    auVar96._0_4_ = (float)(~uVar132 & (uint)fVar145) * 0.055555556 + (float)local_108._0_4_;
    auVar96._4_4_ = (float)(~uVar140 & (uint)fVar155) * 0.055555556 + (float)local_108._4_4_;
    auVar96._8_4_ = (float)(~uVar142 & (uint)fVar90) * 0.055555556 + fStack_100;
    auVar96._12_4_ = (float)(~uVar144 & (uint)fVar190) * 0.055555556 + fStack_fc;
    auVar191 = minps(local_268,_local_108);
    auVar214 = maxps(auVar209,_local_108);
    auVar181._0_8_ =
         CONCAT44((float)local_108._4_4_ - (float)(~uVar79 & (uint)fVar155) * 0.055555556,
                  (float)local_108._0_4_ - (float)(~uVar28 & (uint)fVar145) * 0.055555556);
    auVar181._8_4_ = fStack_100 - (float)(~uVar85 & (uint)fVar90) * 0.055555556;
    auVar181._12_4_ = fStack_fc - (float)(~uVar89 & (uint)fVar190) * 0.055555556;
    auVar32._8_4_ = auVar192._8_4_;
    auVar32._0_8_ = auVar192._0_8_;
    auVar32._12_4_ = auVar192._12_4_;
    auVar95 = minps(auVar32,_local_258);
    auVar235 = minps(auVar235,auVar95);
    auVar33._8_4_ = auVar160._8_4_;
    auVar33._0_8_ = auVar160._0_8_;
    auVar33._12_4_ = auVar160._12_4_;
    auVar95 = minps(auVar33,auVar148);
    auVar133 = minps(auVar133,auVar95);
    auVar34._8_4_ = auVar181._8_4_;
    auVar34._0_8_ = auVar181._0_8_;
    auVar34._12_4_ = auVar181._12_4_;
    auVar95 = minps(auVar34,auVar96);
    auVar95 = minps(auVar191,auVar95);
    auVar97._0_4_ = ~uVar27 & auVar235._0_4_;
    auVar97._4_4_ = ~uVar78 & auVar235._4_4_;
    auVar97._8_4_ = ~uVar84 & auVar235._8_4_;
    auVar97._12_4_ = ~uVar88 & auVar235._12_4_;
    auVar236._0_4_ = local_248._0_4_ & uVar27;
    auVar236._4_4_ = local_248._4_4_ & uVar78;
    auVar236._8_4_ = (uint)uStack_240 & uVar84;
    auVar236._12_4_ = uStack_240._4_4_ & uVar88;
    _local_248 = auVar236 | auVar97;
    local_278._4_4_ = local_278._4_4_ & uVar78 | ~uVar78 & auVar133._4_4_;
    local_278._0_4_ = uVar80 & uVar27 | ~uVar27 & auVar133._0_4_;
    local_278._8_4_ = uVar81 & uVar84 | ~uVar84 & auVar133._8_4_;
    local_278._12_4_ = uVar86 & uVar88 | ~uVar88 & auVar133._12_4_;
    local_268._4_4_ = local_268._4_4_ & uVar78 | ~uVar78 & auVar95._4_4_;
    local_268._0_4_ = uVar17 & uVar27 | ~uVar27 & auVar95._0_4_;
    local_268._8_4_ = uVar29 & uVar84 | ~uVar84 & auVar95._8_4_;
    local_268._12_4_ = uVar30 & uVar88 | ~uVar88 & auVar95._12_4_;
    auVar95 = maxps(auVar192,_local_258);
    auVar133 = maxps(auVar223,auVar95);
    auVar95 = maxps(auVar160,auVar148);
    auVar191 = maxps(auVar217,auVar95);
    auVar95 = maxps(auVar181,auVar96);
    auVar95 = maxps(auVar214,auVar95);
    local_2a8._4_4_ = local_2a8._4_4_ & uVar78 | ~uVar78 & auVar133._4_4_;
    local_2a8._0_4_ = local_2a8._0_4_ & uVar27 | ~uVar27 & auVar133._0_4_;
    local_2a8._8_4_ = local_2a8._8_4_ & uVar84 | ~uVar84 & auVar133._8_4_;
    local_2a8._12_4_ = local_2a8._12_4_ & uVar88 | ~uVar88 & auVar133._12_4_;
    auVar35._0_4_ = ~uVar27 & auVar191._0_4_;
    auVar35._4_4_ = ~uVar78 & auVar191._4_4_;
    auVar35._8_4_ = ~uVar84 & auVar191._8_4_;
    auVar35._12_4_ = ~uVar88 & auVar191._12_4_;
    auVar201._0_4_ = local_288._0_4_ & uVar27;
    auVar201._4_4_ = local_288._4_4_ & uVar78;
    auVar201._8_4_ = local_288._8_4_ & uVar84;
    auVar201._12_4_ = local_288._12_4_ & uVar88;
    local_288 = auVar201 | auVar35;
    auVar208._0_4_ = auVar209._0_4_ & uVar27;
    auVar208._4_4_ = auVar209._4_4_ & uVar78;
    auVar208._8_4_ = auVar209._8_4_ & uVar84;
    auVar208._12_4_ = auVar209._12_4_ & uVar88;
    auVar209._0_4_ = ~uVar27 & auVar95._0_4_;
    auVar209._4_4_ = ~uVar78 & auVar95._4_4_;
    auVar209._8_4_ = ~uVar84 & auVar95._8_4_;
    auVar209._12_4_ = ~uVar88 & auVar95._12_4_;
    auVar209 = auVar208 | auVar209;
    uVar15 = uVar15 + 4;
  }
  fVar221 = fVar221 + fVar156;
  fVar227 = fVar227 + fVar154;
  fVar229 = fVar229 + fVar167;
  fVar222 = fVar222 + fVar26;
  fVar228 = fVar228 + fVar77;
  fVar230 = fVar230 + fVar83;
  fVar26 = (fVar114 + fVar25) * 0.33333334 + fVar221;
  fVar77 = (fVar213 + fVar76) * 0.33333334 + fVar227;
  fVar83 = (fVar168 + fVar82) * 0.33333334 + fVar229;
  fVar24 = fVar222 - (fVar127 + fVar169) * 0.33333334;
  fVar129 = fVar228 - (fVar125 + fVar177) * 0.33333334;
  fVar115 = fVar230 - (fVar143 + fVar178) * 0.33333334;
  auVar36._4_4_ = local_248._0_4_;
  auVar36._0_4_ = local_248._4_4_;
  auVar36._8_4_ = uStack_240._4_4_;
  auVar36._12_4_ = (uint)uStack_240;
  auVar95 = minps(auVar36,_local_248);
  auVar98._0_8_ = auVar95._8_8_;
  auVar98._8_4_ = auVar95._0_4_;
  auVar98._12_4_ = auVar95._4_4_;
  auVar191 = minps(auVar98,auVar95);
  auVar37._4_4_ = uVar80;
  auVar37._0_4_ = local_278._4_4_;
  auVar37._8_4_ = uVar86;
  auVar37._12_4_ = uVar81;
  auVar95 = minps(auVar37,local_278);
  auVar161._0_8_ = auVar95._8_8_;
  auVar161._8_4_ = auVar95._0_4_;
  auVar161._12_4_ = auVar95._4_4_;
  auVar133 = minps(auVar161,auVar95);
  auVar38._4_4_ = uVar17;
  auVar38._0_4_ = local_268._4_4_;
  auVar38._8_4_ = uVar30;
  auVar38._12_4_ = uVar29;
  auVar95 = minps(auVar38,local_268);
  auVar39._0_8_ = auVar95._8_8_;
  auVar39._8_4_ = auVar95._0_4_;
  auVar39._12_4_ = auVar95._4_4_;
  auVar135._4_4_ = auVar133._0_4_;
  auVar135._0_4_ = auVar191._0_4_;
  auVar40._4_4_ = local_2a8._0_4_;
  auVar40._0_4_ = local_2a8._4_4_;
  auVar40._8_4_ = local_2a8._12_4_;
  auVar40._12_4_ = local_2a8._8_4_;
  auVar191 = maxps(auVar40,local_2a8);
  auVar99._0_8_ = auVar191._8_8_;
  auVar99._8_4_ = auVar191._0_4_;
  auVar99._12_4_ = auVar191._4_4_;
  auVar133 = maxps(auVar99,auVar191);
  auVar41._4_4_ = local_288._0_4_;
  auVar41._0_4_ = local_288._4_4_;
  auVar41._8_4_ = local_288._12_4_;
  auVar41._12_4_ = local_288._8_4_;
  auVar191 = maxps(auVar41,local_288);
  auVar162._0_8_ = auVar191._8_8_;
  auVar162._8_4_ = auVar191._0_4_;
  auVar162._12_4_ = auVar191._4_4_;
  auVar214 = maxps(auVar162,auVar191);
  auVar42._4_4_ = auVar209._0_4_;
  auVar42._0_4_ = auVar209._4_4_;
  auVar42._8_4_ = auVar209._12_4_;
  auVar42._12_4_ = auVar209._8_4_;
  auVar191 = maxps(auVar42,auVar209);
  auVar43._0_8_ = auVar191._8_8_;
  auVar43._8_4_ = auVar191._0_4_;
  auVar43._12_4_ = auVar191._4_4_;
  auVar149._4_4_ = auVar214._0_4_;
  auVar149._0_4_ = auVar133._0_4_;
  uVar15 = 0;
  local_268._8_8_ = 0xff800000ff800000;
  local_268._0_8_ = 0xff800000ff800000;
  local_288._8_8_ = 0xff800000ff800000;
  local_288._0_8_ = 0xff800000ff800000;
  uStack_250 = 0xff800000ff800000;
  local_258 = (undefined1  [8])0xff800000ff800000;
  local_2a8._8_8_ = 0x7f8000007f800000;
  local_2a8._0_8_ = 0x7f8000007f800000;
  local_228 = 0x7f800000;
  uStack_224 = 0x7f800000;
  uStack_220 = 0x7f800000;
  uStack_21c = 0x7f800000;
  local_278._8_8_ = 0x7f8000007f800000;
  local_278._0_8_ = 0x7f8000007f800000;
  while( true ) {
    if (7 < uVar15) break;
    uVar17 = (uint)uVar15;
    uVar29 = -(uint)(-0x7ffffff9 < (int)(uVar17 ^ 0x80000000));
    uVar80 = -(uint)(-0x7ffffff9 < (int)(uVar17 ^ 0x80000000));
    uVar86 = -(uint)(-0x7ffffff9 < (int)(uVar17 ^ 0x80000000));
    uVar27 = -(uint)(-0x7ffffff9 < (int)(uVar17 ^ 0x80000000));
    lVar12 = uVar15 * 4;
    fVar125 = *(float *)(bezier_basis0 + lVar12 + 0x1dc);
    fVar127 = *(float *)(bezier_basis0 + lVar12 + 0x1e0);
    fVar143 = *(float *)(bezier_basis0 + lVar12 + 0x1e4);
    fVar131 = *(float *)(bezier_basis0 + lVar12 + 0x1e8);
    lVar12 = uVar15 * 4;
    fVar139 = *(float *)(bezier_basis0 + lVar12 + 0x660);
    fVar141 = *(float *)(bezier_basis0 + lVar12 + 0x664);
    fVar156 = *(float *)(bezier_basis0 + lVar12 + 0x668);
    fVar145 = *(float *)(bezier_basis0 + lVar12 + 0x66c);
    lVar12 = uVar15 * 4;
    fVar154 = *(float *)(bezier_basis0 + lVar12 + 0xae4);
    fVar155 = *(float *)(bezier_basis0 + lVar12 + 0xae8);
    fVar167 = *(float *)(bezier_basis0 + lVar12 + 0xaec);
    fVar90 = *(float *)(bezier_basis0 + lVar12 + 0xaf0);
    lVar12 = uVar15 * 4;
    fVar114 = *(float *)(bezier_basis0 + lVar12 + 0xf68);
    fVar213 = *(float *)(bezier_basis0 + lVar12 + 0xf6c);
    fVar168 = *(float *)(bezier_basis0 + lVar12 + 0xf70);
    fVar176 = *(float *)(bezier_basis0 + lVar12 + 0xf74);
    auVar182._0_4_ = fVar221 * fVar125 + fVar26 * fVar139 + fVar24 * fVar154 + fVar222 * fVar114;
    auVar182._4_4_ = fVar221 * fVar127 + fVar26 * fVar141 + fVar24 * fVar155 + fVar222 * fVar213;
    auVar182._8_4_ = fVar221 * fVar143 + fVar26 * fVar156 + fVar24 * fVar167 + fVar222 * fVar168;
    auVar182._12_4_ = fVar221 * fVar131 + fVar26 * fVar145 + fVar24 * fVar90 + fVar222 * fVar176;
    auVar193._0_4_ = fVar227 * fVar125 + fVar77 * fVar139 + fVar129 * fVar154 + fVar228 * fVar114;
    auVar193._4_4_ = fVar227 * fVar127 + fVar77 * fVar141 + fVar129 * fVar155 + fVar228 * fVar213;
    auVar193._8_4_ = fVar227 * fVar143 + fVar77 * fVar156 + fVar129 * fVar167 + fVar228 * fVar168;
    auVar193._12_4_ = fVar227 * fVar131 + fVar77 * fVar145 + fVar129 * fVar90 + fVar228 * fVar176;
    local_f8._0_4_ = fVar125 * fVar229 + fVar139 * fVar83 + fVar154 * fVar115 + fVar114 * fVar230;
    local_f8._4_4_ = fVar127 * fVar229 + fVar141 * fVar83 + fVar155 * fVar115 + fVar213 * fVar230;
    fStack_f0 = fVar143 * fVar229 + fVar156 * fVar83 + fVar167 * fVar115 + fVar168 * fVar230;
    fStack_ec = fVar131 * fVar229 + fVar145 * fVar83 + fVar90 * fVar115 + fVar176 * fVar230;
    lVar12 = uVar15 * 4;
    fVar125 = *(float *)(bezier_basis0 + lVar12 + 0x13ec);
    fVar127 = *(float *)(bezier_basis0 + lVar12 + 0x13f0);
    fVar143 = *(float *)(bezier_basis0 + lVar12 + 0x13f4);
    fVar131 = *(float *)(bezier_basis0 + lVar12 + 0x13f8);
    lVar12 = uVar15 * 4;
    fVar139 = *(float *)(bezier_basis0 + lVar12 + 0x1870);
    fVar141 = *(float *)(bezier_basis0 + lVar12 + 0x1874);
    fVar156 = *(float *)(bezier_basis0 + lVar12 + 0x1878);
    fVar145 = *(float *)(bezier_basis0 + lVar12 + 0x187c);
    lVar12 = uVar15 * 4;
    fVar154 = *(float *)(bezier_basis0 + lVar12 + 0x1cf4);
    fVar155 = *(float *)(bezier_basis0 + lVar12 + 0x1cf8);
    fVar167 = *(float *)(bezier_basis0 + lVar12 + 0x1cfc);
    fVar90 = *(float *)(bezier_basis0 + lVar12 + 0x1d00);
    lVar12 = uVar15 * 4;
    fVar114 = *(float *)(bezier_basis0 + lVar12 + 0x2178);
    fVar213 = *(float *)(bezier_basis0 + lVar12 + 0x217c);
    fVar168 = *(float *)(bezier_basis0 + lVar12 + 0x2180);
    fVar176 = *(float *)(bezier_basis0 + lVar12 + 0x2184);
    fVar187 = fVar221 * fVar125 + fVar26 * fVar139 + fVar24 * fVar154 + fVar222 * fVar114;
    fVar188 = fVar221 * fVar127 + fVar26 * fVar141 + fVar24 * fVar155 + fVar222 * fVar213;
    fVar190 = fVar221 * fVar143 + fVar26 * fVar156 + fVar24 * fVar167 + fVar222 * fVar168;
    fVar234 = fVar221 * fVar131 + fVar26 * fVar145 + fVar24 * fVar90 + fVar222 * fVar176;
    fVar239 = fVar227 * fVar125 + fVar77 * fVar139 + fVar129 * fVar154 + fVar228 * fVar114;
    fVar240 = fVar227 * fVar127 + fVar77 * fVar141 + fVar129 * fVar155 + fVar228 * fVar213;
    fVar25 = fVar227 * fVar143 + fVar77 * fVar156 + fVar129 * fVar167 + fVar228 * fVar168;
    fVar76 = fVar227 * fVar131 + fVar77 * fVar145 + fVar129 * fVar90 + fVar228 * fVar176;
    fVar125 = fVar125 * fVar229 + fVar139 * fVar83 + fVar154 * fVar115 + fVar114 * fVar230;
    fVar127 = fVar127 * fVar229 + fVar141 * fVar83 + fVar155 * fVar115 + fVar213 * fVar230;
    fVar143 = fVar143 * fVar229 + fVar156 * fVar83 + fVar167 * fVar115 + fVar168 * fVar230;
    fVar131 = fVar131 * fVar229 + fVar145 * fVar83 + fVar90 * fVar115 + fVar176 * fVar230;
    uVar30 = -(uint)(uVar17 == 0);
    uVar81 = -(uint)(uVar17 == 1);
    uVar144 = -(uint)(uVar17 == 2);
    uVar28 = -(uint)(uVar17 == 3);
    uVar78 = -(uint)(uVar17 == 7);
    uVar79 = -(uint)(uVar17 == 6);
    uVar84 = -(uint)(uVar17 == 5);
    uVar17 = -(uint)(uVar17 == 4);
    local_248._4_4_ = (float)(~uVar79 & (uint)fVar188) * 0.055555556 + auVar182._4_4_;
    local_248._0_4_ = (float)(~uVar78 & (uint)fVar187) * 0.055555556 + auVar182._0_4_;
    uStack_240._0_4_ = (uint)((float)(~uVar84 & (uint)fVar190) * 0.055555556 + auVar182._8_4_);
    uStack_240._4_4_ = (uint)((float)(~uVar17 & (uint)fVar234) * 0.055555556 + auVar182._12_4_);
    auVar217 = minps(local_2a8,auVar182);
    auVar223 = maxps(local_268,auVar182);
    auVar224._0_8_ =
         CONCAT44(auVar182._4_4_ - (float)(~uVar81 & (uint)fVar188) * 0.055555556,
                  auVar182._0_4_ - (float)(~uVar30 & (uint)fVar187) * 0.055555556);
    auVar224._8_4_ = auVar182._8_4_ - (float)(~uVar144 & (uint)fVar190) * 0.055555556;
    auVar224._12_4_ = auVar182._12_4_ - (float)(~uVar28 & (uint)fVar234) * 0.055555556;
    auVar183._0_4_ = (float)(~uVar78 & (uint)fVar239) * 0.055555556 + auVar193._0_4_;
    auVar183._4_4_ = (float)(~uVar79 & (uint)fVar240) * 0.055555556 + auVar193._4_4_;
    auVar183._8_4_ = (float)(~uVar84 & (uint)fVar25) * 0.055555556 + auVar193._8_4_;
    auVar183._12_4_ = (float)(~uVar17 & (uint)fVar76) * 0.055555556 + auVar193._12_4_;
    auVar10._4_4_ = uStack_224;
    auVar10._0_4_ = local_228;
    auVar10._8_4_ = uStack_220;
    auVar10._12_4_ = uStack_21c;
    auVar235 = minps(auVar10,auVar193);
    auVar218 = maxps(local_288,auVar193);
    auVar237._0_8_ =
         CONCAT44(auVar193._4_4_ - (float)(~uVar81 & (uint)fVar240) * 0.055555556,
                  auVar193._0_4_ - (float)(~uVar30 & (uint)fVar239) * 0.055555556);
    auVar237._8_4_ = auVar193._8_4_ - (float)(~uVar144 & (uint)fVar25) * 0.055555556;
    auVar237._12_4_ = auVar193._12_4_ - (float)(~uVar28 & (uint)fVar76) * 0.055555556;
    auVar100._0_4_ = (float)(~uVar78 & (uint)fVar125) * 0.055555556 + (float)local_f8._0_4_;
    auVar100._4_4_ = (float)(~uVar79 & (uint)fVar127) * 0.055555556 + (float)local_f8._4_4_;
    auVar100._8_4_ = (float)(~uVar84 & (uint)fVar143) * 0.055555556 + fStack_f0;
    auVar100._12_4_ = (float)(~uVar17 & (uint)fVar131) * 0.055555556 + fStack_ec;
    auVar214 = minps(local_278,_local_f8);
    auVar215 = maxps(_local_258,_local_f8);
    auVar194._0_8_ =
         CONCAT44((float)local_f8._4_4_ - (float)(~uVar81 & (uint)fVar127) * 0.055555556,
                  (float)local_f8._0_4_ - (float)(~uVar30 & (uint)fVar125) * 0.055555556);
    auVar194._8_4_ = fStack_f0 - (float)(~uVar144 & (uint)fVar143) * 0.055555556;
    auVar194._12_4_ = fStack_ec - (float)(~uVar28 & (uint)fVar131) * 0.055555556;
    auVar44._8_4_ = auVar224._8_4_;
    auVar44._0_8_ = auVar224._0_8_;
    auVar44._12_4_ = auVar224._12_4_;
    auVar133 = minps(auVar44,_local_248);
    auVar233 = minps(auVar217,auVar133);
    auVar45._8_4_ = auVar237._8_4_;
    auVar45._0_8_ = auVar237._0_8_;
    auVar45._12_4_ = auVar237._12_4_;
    auVar133 = minps(auVar45,auVar183);
    auVar217 = minps(auVar235,auVar133);
    auVar46._8_4_ = auVar194._8_4_;
    auVar46._0_8_ = auVar194._0_8_;
    auVar46._12_4_ = auVar194._12_4_;
    auVar133 = minps(auVar46,auVar100);
    auVar133 = minps(auVar214,auVar133);
    local_2a8._4_4_ = local_2a8._4_4_ & uVar80 | ~uVar80 & auVar233._4_4_;
    local_2a8._0_4_ = local_2a8._0_4_ & uVar29 | ~uVar29 & auVar233._0_4_;
    local_2a8._8_4_ = local_2a8._8_4_ & uVar86 | ~uVar86 & auVar233._8_4_;
    local_2a8._12_4_ = local_2a8._12_4_ & uVar27 | ~uVar27 & auVar233._12_4_;
    local_228 = local_228 & uVar29 | ~uVar29 & auVar217._0_4_;
    uStack_224 = uStack_224 & uVar80 | ~uVar80 & auVar217._4_4_;
    uStack_220 = uStack_220 & uVar86 | ~uVar86 & auVar217._8_4_;
    uStack_21c = uStack_21c & uVar27 | ~uVar27 & auVar217._12_4_;
    auVar134._0_4_ = ~uVar29 & auVar133._0_4_;
    auVar134._4_4_ = ~uVar80 & auVar133._4_4_;
    auVar134._8_4_ = ~uVar86 & auVar133._8_4_;
    auVar134._12_4_ = ~uVar27 & auVar133._12_4_;
    auVar202._0_4_ = local_278._0_4_ & uVar29;
    auVar202._4_4_ = local_278._4_4_ & uVar80;
    auVar202._8_4_ = local_278._8_4_ & uVar86;
    auVar202._12_4_ = local_278._12_4_ & uVar27;
    local_278 = auVar202 | auVar134;
    auVar133 = maxps(auVar224,_local_248);
    auVar133 = maxps(auVar223,auVar133);
    auVar214 = maxps(auVar237,auVar183);
    auVar217 = maxps(auVar218,auVar214);
    auVar214 = maxps(auVar194,auVar100);
    auVar214 = maxps(auVar215,auVar214);
    auVar47._0_4_ = ~uVar29 & auVar133._0_4_;
    auVar47._4_4_ = ~uVar80 & auVar133._4_4_;
    auVar47._8_4_ = ~uVar86 & auVar133._8_4_;
    auVar47._12_4_ = ~uVar27 & auVar133._12_4_;
    auVar210._0_4_ = local_268._0_4_ & uVar29;
    auVar210._4_4_ = local_268._4_4_ & uVar80;
    auVar210._8_4_ = local_268._8_4_ & uVar86;
    auVar210._12_4_ = local_268._12_4_ & uVar27;
    local_268 = auVar210 | auVar47;
    auVar48._0_4_ = ~uVar29 & auVar217._0_4_;
    auVar48._4_4_ = ~uVar80 & auVar217._4_4_;
    auVar48._8_4_ = ~uVar86 & auVar217._8_4_;
    auVar48._12_4_ = ~uVar27 & auVar217._12_4_;
    auVar163._0_4_ = local_288._0_4_ & uVar29;
    auVar163._4_4_ = local_288._4_4_ & uVar80;
    auVar163._8_4_ = local_288._8_4_ & uVar86;
    auVar163._12_4_ = local_288._12_4_ & uVar27;
    local_288 = auVar163 | auVar48;
    auVar170._0_4_ = local_258._0_4_ & uVar29;
    auVar170._4_4_ = local_258._4_4_ & uVar80;
    auVar170._8_4_ = local_258._8_4_ & uVar86;
    auVar170._12_4_ = local_258._12_4_ & uVar27;
    auVar101._0_4_ = ~uVar29 & auVar214._0_4_;
    auVar101._4_4_ = ~uVar80 & auVar214._4_4_;
    auVar101._8_4_ = ~uVar86 & auVar214._8_4_;
    auVar101._12_4_ = ~uVar27 & auVar214._12_4_;
    _local_258 = auVar170 | auVar101;
    uVar15 = uVar15 + 4;
  }
  auVar95 = minps(auVar39,auVar95);
  auVar135._8_4_ = auVar95._0_4_;
  auVar135._12_4_ = 0;
  auVar95 = maxps(auVar43,auVar191);
  auVar149._8_4_ = auVar95._0_4_;
  auVar149._12_4_ = 0;
  auVar49._4_4_ = local_2a8._0_4_;
  auVar49._0_4_ = local_2a8._4_4_;
  auVar49._8_4_ = local_2a8._12_4_;
  auVar49._12_4_ = local_2a8._8_4_;
  auVar95 = minps(auVar49,local_2a8);
  auVar102._0_8_ = auVar95._8_8_;
  auVar102._8_4_ = auVar95._0_4_;
  auVar102._12_4_ = auVar95._4_4_;
  auVar191 = minps(auVar102,auVar95);
  auVar11._4_4_ = uStack_224;
  auVar11._0_4_ = local_228;
  auVar11._8_4_ = uStack_220;
  auVar11._12_4_ = uStack_21c;
  auVar50._4_4_ = local_228;
  auVar50._0_4_ = uStack_224;
  auVar50._8_4_ = uStack_21c;
  auVar50._12_4_ = uStack_220;
  auVar95 = minps(auVar50,auVar11);
  auVar117._0_8_ = auVar95._8_8_;
  auVar117._8_4_ = auVar95._0_4_;
  auVar117._12_4_ = auVar95._4_4_;
  auVar133 = minps(auVar117,auVar95);
  auVar51._4_4_ = local_278._0_4_;
  auVar51._0_4_ = local_278._4_4_;
  auVar51._8_4_ = local_278._12_4_;
  auVar51._12_4_ = local_278._8_4_;
  auVar95 = minps(auVar51,local_278);
  auVar103._0_8_ = auVar95._8_8_;
  auVar103._8_4_ = auVar95._0_4_;
  auVar103._12_4_ = auVar95._4_4_;
  auVar95 = minps(auVar103,auVar95);
  auVar118._4_4_ = auVar133._0_4_;
  auVar118._0_4_ = auVar191._0_4_;
  auVar118._8_4_ = auVar95._0_4_;
  auVar118._12_4_ = 0;
  auVar214 = minps(auVar135,auVar118);
  auVar52._4_4_ = local_268._0_4_;
  auVar52._0_4_ = local_268._4_4_;
  auVar52._8_4_ = local_268._12_4_;
  auVar52._12_4_ = local_268._8_4_;
  auVar95 = maxps(auVar52,local_268);
  auVar104._0_8_ = auVar95._8_8_;
  auVar104._8_4_ = auVar95._0_4_;
  auVar104._12_4_ = auVar95._4_4_;
  auVar191 = maxps(auVar104,auVar95);
  auVar53._4_4_ = local_288._0_4_;
  auVar53._0_4_ = local_288._4_4_;
  auVar53._8_4_ = local_288._12_4_;
  auVar53._12_4_ = local_288._8_4_;
  auVar95 = maxps(auVar53,local_288);
  auVar119._0_8_ = auVar95._8_8_;
  auVar119._8_4_ = auVar95._0_4_;
  auVar119._12_4_ = auVar95._4_4_;
  auVar133 = maxps(auVar119,auVar95);
  auVar54._4_4_ = local_258._0_4_;
  auVar54._0_4_ = local_258._4_4_;
  auVar54._8_4_ = local_258._12_4_;
  auVar54._12_4_ = local_258._8_4_;
  auVar95 = maxps(auVar54,_local_258);
  auVar105._0_8_ = auVar95._8_8_;
  auVar105._8_4_ = auVar95._0_4_;
  auVar105._12_4_ = auVar95._4_4_;
  auVar95 = maxps(auVar105,auVar95);
  auVar120._4_4_ = auVar133._0_4_;
  auVar120._0_4_ = auVar191._0_4_;
  auVar120._8_4_ = auVar95._0_4_;
  auVar120._12_4_ = 0;
  auVar95 = maxps(auVar149,auVar120);
  auVar150._0_4_ = -(uint)(auVar95._0_4_ < 1.844e+18 && -1.844e+18 < auVar214._0_4_);
  auVar150._4_4_ = -(uint)(auVar95._4_4_ < 1.844e+18 && -1.844e+18 < auVar214._4_4_);
  auVar150._8_4_ = -(uint)(auVar95._8_4_ < 1.844e+18 && -1.844e+18 < auVar214._8_4_);
  auVar150._12_4_ = -(uint)(auVar95._12_4_ < 1.844e+18 && -1.844e+18 < auVar214._12_4_);
  uVar13 = movmskps((int)pcVar7,auVar150);
  lVar19 = lVar19 + 1;
  if ((~(byte)uVar13 & 7) != 0) goto LAB_002449f1;
  goto LAB_002439df;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }